

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ushort uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  RTCRayQueryContext *pRVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  size_t k;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  ulong uVar50;
  byte bVar51;
  int iVar52;
  ulong uVar53;
  byte bVar54;
  long lVar55;
  ulong uVar56;
  byte bVar57;
  undefined1 (*pauVar58) [32];
  long lVar59;
  byte bVar60;
  ulong *puVar61;
  NodeRef root;
  ulong uVar62;
  long lVar63;
  float *pfVar64;
  uint i_1;
  undefined4 uVar65;
  bool bVar66;
  ulong uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  vfloat_impl<8> vVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar91;
  float fVar97;
  float fVar98;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar99;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [32];
  uint uVar122;
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar138 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar148 [36];
  undefined1 auVar147 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  Precalculations pre;
  vfloat<4> upper_y;
  vfloat<4> lower_z;
  vfloat<4> upper_z;
  vfloat<4> lower_x;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<4> lower_y;
  TravRayK<8,_false> tray;
  vfloat<4> upper_x;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2d94;
  uint local_2d80;
  Precalculations local_2d79;
  uint local_2d78;
  uint local_2d74;
  undefined1 local_2d70 [16];
  undefined1 local_2d60 [16];
  RTCFilterFunctionNArguments local_2d50;
  float local_2d20;
  float fStack_2d1c;
  float fStack_2d18;
  float fStack_2d14;
  float fStack_2d10;
  float fStack_2d0c;
  float fStack_2d08;
  float fStack_2d04;
  Geometry *local_2cf8;
  ulong local_2cf0;
  undefined4 local_2ce8;
  undefined4 local_2ce4;
  undefined1 local_2ce0 [8];
  float fStack_2cd8;
  float fStack_2cd4;
  float fStack_2cd0;
  float fStack_2ccc;
  float fStack_2cc8;
  float fStack_2cc4;
  undefined1 local_2cc0 [8];
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float fStack_2ca4;
  undefined1 (*local_2c90) [32];
  RayK<8> *local_2c88;
  long local_2c80;
  long local_2c78;
  long local_2c70;
  ulong local_2c68;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float fStack_2c44;
  undefined1 local_2c40 [32];
  float local_2c20;
  float fStack_2c1c;
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  float fStack_2c04;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  BVH *local_2be0;
  Intersectors *local_2bd8;
  long local_2bd0;
  long local_2bc8;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2bc0;
  undefined1 local_2ba0 [16];
  undefined1 local_2b90 [16];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2b20;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined1 local_2aa0 [8];
  float fStack_2a98;
  float fStack_2a94;
  float fStack_2a90;
  float fStack_2a8c;
  float fStack_2a88;
  float fStack_2a84;
  undefined1 local_2a80 [8];
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  float fStack_2a64;
  undefined1 local_2a60 [32];
  uint local_2a40;
  uint uStack_2a3c;
  uint uStack_2a38;
  uint uStack_2a34;
  uint uStack_2a30;
  uint uStack_2a2c;
  uint uStack_2a28;
  uint uStack_2a24;
  uint local_2a20;
  uint uStack_2a1c;
  uint uStack_2a18;
  uint uStack_2a14;
  uint uStack_2a10;
  uint uStack_2a0c;
  uint uStack_2a08;
  uint uStack_2a04;
  undefined1 local_2a00 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_29e0;
  RTCRayQueryContext local_29c0 [4];
  undefined1 local_29a0 [16];
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2940;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined4 uStack_2804;
  float local_2800;
  float fStack_27fc;
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined4 uStack_27e4;
  undefined1 local_27e0 [32];
  int local_27c0;
  int iStack_27bc;
  int iStack_27b8;
  int iStack_27b4;
  int iStack_27b0;
  int iStack_27ac;
  int iStack_27a8;
  int iStack_27a4;
  uint local_27a0;
  uint uStack_279c;
  uint uStack_2798;
  uint uStack_2794;
  uint uStack_2790;
  uint uStack_278c;
  uint uStack_2788;
  uint uStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  undefined1 local_2760 [32];
  uint local_2740;
  uint uStack_273c;
  uint uStack_2738;
  uint uStack_2734;
  uint uStack_2730;
  uint uStack_272c;
  uint uStack_2728;
  uint uStack_2724;
  undefined1 local_2710 [16];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [16];
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined1 local_26c0 [16];
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined1 local_2690 [16];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [16];
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined1 local_2630 [16];
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar146 [36];
  undefined1 auVar149 [36];
  
  local_2608 = (((BVH *)This->ptr)->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar73 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar68 = ZEXT816(0) << 0x40;
      uVar67 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar68),5);
      uVar62 = vpcmpeqd_avx512vl(auVar73,(undefined1  [32])valid_i->field_0);
      uVar67 = uVar67 & uVar62;
      bVar60 = (byte)uVar67;
      if (bVar60 != 0) {
        local_2940._0_4_ = *(float *)ray;
        local_2940._4_4_ = *(float *)(ray + 4);
        local_2940._8_4_ = *(float *)(ray + 8);
        local_2940._12_4_ = *(float *)(ray + 0xc);
        local_2940._16_4_ = *(float *)(ray + 0x10);
        local_2940._20_4_ = *(float *)(ray + 0x14);
        local_2940._24_4_ = *(float *)(ray + 0x18);
        local_2940._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_2940._32_4_ = *(float *)(ray + 0x20);
        local_2940._36_4_ = *(float *)(ray + 0x24);
        local_2940._40_4_ = *(float *)(ray + 0x28);
        local_2940._44_4_ = *(float *)(ray + 0x2c);
        local_2940._48_4_ = *(float *)(ray + 0x30);
        local_2940._52_4_ = *(float *)(ray + 0x34);
        local_2940._56_4_ = *(float *)(ray + 0x38);
        local_2940._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_2940._64_4_ = *(float *)(ray + 0x40);
        local_2940._68_4_ = *(float *)(ray + 0x44);
        local_2940._72_4_ = *(float *)(ray + 0x48);
        local_2940._76_4_ = *(float *)(ray + 0x4c);
        local_2940._80_4_ = *(float *)(ray + 0x50);
        local_2940._84_4_ = *(float *)(ray + 0x54);
        local_2940._88_4_ = *(float *)(ray + 0x58);
        local_2940._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_28e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_28c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_28a0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar150 = ZEXT3264(auVar73);
        vandps_avx512vl(local_28e0,auVar73);
        auVar74._8_4_ = 0x219392ef;
        auVar74._0_8_ = 0x219392ef219392ef;
        auVar74._12_4_ = 0x219392ef;
        auVar74._16_4_ = 0x219392ef;
        auVar74._20_4_ = 0x219392ef;
        auVar74._24_4_ = 0x219392ef;
        auVar74._28_4_ = 0x219392ef;
        uVar62 = vcmpps_avx512vl(auVar73,auVar74,1);
        bVar66 = (bool)((byte)uVar62 & 1);
        auVar75._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._0_4_;
        bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar75._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._4_4_;
        bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar75._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._8_4_;
        bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar75._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._12_4_;
        bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar75._16_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._16_4_;
        bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar75._20_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._20_4_;
        bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar75._24_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._24_4_;
        bVar66 = SUB81(uVar62 >> 7,0);
        auVar75._28_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28e0._28_4_;
        vandps_avx512vl(local_28c0,auVar73);
        uVar62 = vcmpps_avx512vl(auVar75,auVar74,1);
        bVar66 = (bool)((byte)uVar62 & 1);
        auVar78._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._0_4_;
        bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar78._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._4_4_;
        bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar78._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._8_4_;
        bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar78._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._12_4_;
        bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar78._16_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._16_4_;
        bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar78._20_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._20_4_;
        bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar78._24_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._24_4_;
        bVar66 = SUB81(uVar62 >> 7,0);
        auVar78._28_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28c0._28_4_;
        vandps_avx512vl(local_28a0,auVar73);
        uVar62 = vcmpps_avx512vl(auVar78,auVar74,1);
        bVar66 = (bool)((byte)uVar62 & 1);
        auVar73._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._0_4_;
        bVar66 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar73._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._4_4_;
        bVar66 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar73._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._8_4_;
        bVar66 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar73._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._12_4_;
        bVar66 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar73._16_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._16_4_;
        bVar66 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar73._20_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._20_4_;
        bVar66 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar73._24_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._24_4_;
        bVar66 = SUB81(uVar62 >> 7,0);
        auVar73._28_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * local_28a0._28_4_;
        auVar76._8_4_ = 0x3f800000;
        auVar76._0_8_ = 0x3f8000003f800000;
        auVar76._12_4_ = 0x3f800000;
        auVar76._16_4_ = 0x3f800000;
        auVar76._20_4_ = 0x3f800000;
        auVar76._24_4_ = 0x3f800000;
        auVar76._28_4_ = 0x3f800000;
        auVar74 = vrcp14ps_avx512vl(auVar75);
        auVar70 = vfnmadd213ps_fma(auVar75,auVar74,auVar76);
        auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar74,auVar74);
        auVar75 = vrcp14ps_avx512vl(auVar78);
        auVar92 = vfnmadd213ps_fma(auVar78,auVar75,auVar76);
        auVar92 = vfmadd132ps_fma(ZEXT1632(auVar92),auVar75,auVar75);
        auVar75 = vrcp14ps_avx512vl(auVar73);
        auVar72 = vfnmadd213ps_fma(auVar73,auVar75,auVar76);
        local_2880 = ZEXT1632(auVar70);
        local_2860 = ZEXT1632(auVar92);
        auVar72 = vfmadd132ps_fma(ZEXT1632(auVar72),auVar75,auVar75);
        local_2840 = ZEXT1632(auVar72);
        local_27e0._4_4_ = *(float *)(ray + 0x44) * auVar72._4_4_;
        local_27e0._0_4_ = *(float *)(ray + 0x40) * auVar72._0_4_;
        local_27e0._8_4_ = *(float *)(ray + 0x48) * auVar72._8_4_;
        local_27e0._12_4_ = *(float *)(ray + 0x4c) * auVar72._12_4_;
        local_27e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
        local_27e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
        local_27e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
        local_27e0._28_4_ = *(undefined4 *)(ray + 0x5c);
        local_2820 = *(float *)ray * auVar70._0_4_;
        fStack_281c = *(float *)(ray + 4) * auVar70._4_4_;
        fStack_2818 = *(float *)(ray + 8) * auVar70._8_4_;
        fStack_2814 = *(float *)(ray + 0xc) * auVar70._12_4_;
        fStack_2810 = *(float *)(ray + 0x10) * 0.0;
        fStack_280c = *(float *)(ray + 0x14) * 0.0;
        fStack_2808 = *(float *)(ray + 0x18) * 0.0;
        uStack_2804 = *(undefined4 *)(ray + 0x1c);
        local_2800 = *(float *)(ray + 0x20) * auVar92._0_4_;
        fStack_27fc = *(float *)(ray + 0x24) * auVar92._4_4_;
        fStack_27f8 = *(float *)(ray + 0x28) * auVar92._8_4_;
        fStack_27f4 = *(float *)(ray + 0x2c) * auVar92._12_4_;
        fStack_27f0 = *(float *)(ray + 0x30) * 0.0;
        fStack_27ec = *(float *)(ray + 0x34) * 0.0;
        fStack_27e8 = *(float *)(ray + 0x38) * 0.0;
        uStack_27e4 = *(undefined4 *)(ray + 0x3c);
        uVar62 = vcmpps_avx512vl(ZEXT1632(auVar70),ZEXT1632(auVar68),1);
        auVar73 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27c0 = (uint)((byte)uVar62 & 1) * auVar73._0_4_;
        iStack_27bc = (uint)((byte)(uVar62 >> 1) & 1) * auVar73._4_4_;
        iStack_27b8 = (uint)((byte)(uVar62 >> 2) & 1) * auVar73._8_4_;
        iStack_27b4 = (uint)((byte)(uVar62 >> 3) & 1) * auVar73._12_4_;
        iStack_27b0 = (uint)((byte)(uVar62 >> 4) & 1) * auVar73._16_4_;
        iStack_27ac = (uint)((byte)(uVar62 >> 5) & 1) * auVar73._20_4_;
        iStack_27a8 = (uint)((byte)(uVar62 >> 6) & 1) * auVar73._24_4_;
        iStack_27a4 = (uint)(byte)(uVar62 >> 7) * auVar73._28_4_;
        auVar75 = ZEXT1632(auVar68);
        uVar62 = vcmpps_avx512vl(ZEXT1632(auVar92),auVar75,5);
        auVar73 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar66 = (bool)((byte)uVar62 & 1);
        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar19 = SUB81(uVar62 >> 7,0);
        local_27a0 = (uint)bVar66 * auVar73._0_4_ | (uint)!bVar66 * 0x30;
        uStack_279c = (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * 0x30;
        uStack_2798 = (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * 0x30;
        uStack_2794 = (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * 0x30;
        uStack_2790 = (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * 0x30;
        uStack_278c = (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * 0x30;
        uStack_2788 = (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * 0x30;
        uStack_2784 = (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * 0x30;
        uVar62 = vcmpps_avx512vl(ZEXT1632(auVar72),auVar75,5);
        auVar73 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar66 = (bool)((byte)uVar62 & 1);
        bVar9 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar62 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar62 >> 6) & 1);
        bVar19 = SUB81(uVar62 >> 7,0);
        local_2780 = (uint)bVar66 * auVar73._0_4_ | (uint)!bVar66 * 0x50;
        uStack_277c = (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * 0x50;
        uStack_2778 = (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * 0x50;
        uStack_2774 = (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * 0x50;
        uStack_2770 = (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * 0x50;
        uStack_276c = (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * 0x50;
        uStack_2768 = (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * 0x50;
        uStack_2764 = (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar152 = ZEXT3264(local_1e80);
        auVar73 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar75);
        local_2760._0_4_ =
             (uint)(bVar60 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar60 & 1) * local_1e80._0_4_;
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        local_2760._4_4_ = (uint)bVar66 * auVar73._4_4_ | (uint)!bVar66 * local_1e80._4_4_;
        bVar66 = (bool)((byte)(uVar67 >> 2) & 1);
        local_2760._8_4_ = (uint)bVar66 * auVar73._8_4_ | (uint)!bVar66 * local_1e80._8_4_;
        bVar66 = (bool)((byte)(uVar67 >> 3) & 1);
        local_2760._12_4_ = (uint)bVar66 * auVar73._12_4_ | (uint)!bVar66 * local_1e80._12_4_;
        bVar66 = (bool)((byte)(uVar67 >> 4) & 1);
        local_2760._16_4_ = (uint)bVar66 * auVar73._16_4_ | (uint)!bVar66 * local_1e80._16_4_;
        bVar66 = (bool)((byte)(uVar67 >> 5) & 1);
        local_2760._20_4_ = (uint)bVar66 * auVar73._20_4_ | (uint)!bVar66 * local_1e80._20_4_;
        bVar66 = (bool)((byte)(uVar67 >> 6) & 1);
        local_2760._24_4_ = (uint)bVar66 * auVar73._24_4_ | (uint)!bVar66 * local_1e80._24_4_;
        bVar66 = SUB81(uVar67 >> 7,0);
        local_2760._28_4_ = (uint)bVar66 * auVar73._28_4_ | (uint)!bVar66 * local_1e80._28_4_;
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar151 = ZEXT3264(auVar73);
        local_2ce4 = (int)uVar67;
        auVar75 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar75);
        bVar66 = (bool)((byte)(uVar67 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar67 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar67 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar67 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar67 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar67 >> 6) & 1);
        bVar16 = SUB81(uVar67 >> 7,0);
        local_2740 = (uint)(bVar60 & 1) * auVar75._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar73._0_4_;
        uStack_273c = (uint)bVar66 * auVar75._4_4_ | (uint)!bVar66 * auVar73._4_4_;
        uStack_2738 = (uint)bVar9 * auVar75._8_4_ | (uint)!bVar9 * auVar73._8_4_;
        uStack_2734 = (uint)bVar10 * auVar75._12_4_ | (uint)!bVar10 * auVar73._12_4_;
        uStack_2730 = (uint)bVar11 * auVar75._16_4_ | (uint)!bVar11 * auVar73._16_4_;
        uStack_272c = (uint)bVar12 * auVar75._20_4_ | (uint)!bVar12 * auVar73._20_4_;
        uStack_2728 = (uint)bVar13 * auVar75._24_4_ | (uint)!bVar13 * auVar73._24_4_;
        uStack_2724 = (uint)bVar16 * auVar75._28_4_ | (uint)!bVar16 * auVar73._28_4_;
        local_2bd8 = This;
        local_2be0 = (BVH *)This->ptr;
        local_2d94 = (uint)(byte)~bVar60;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar67 = 5;
        }
        else {
          uVar67 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2c88 = ray + 0x100;
        puVar61 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar58 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2760;
        local_2c90 = (undefined1 (*) [32])&local_2a40;
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar153 = ZEXT3264(auVar73);
        auVar68 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar154 = ZEXT1664(auVar68);
        local_2cf0 = uVar67;
LAB_01d1839b:
        do {
          auVar73 = auVar151._0_32_;
          auVar77._4_4_ = uStack_273c;
          auVar77._0_4_ = local_2740;
          auVar77._8_4_ = uStack_2738;
          auVar77._12_4_ = uStack_2734;
          auVar77._16_4_ = uStack_2730;
          auVar77._20_4_ = uStack_272c;
          auVar77._24_4_ = uStack_2728;
          auVar77._28_4_ = uStack_2724;
          do {
            root.ptr = puVar61[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01d1984c;
            puVar61 = puVar61 + -1;
            _local_2ce0 = pauVar58[-1];
            auVar132 = ZEXT3264(_local_2ce0);
            pauVar58 = pauVar58 + -1;
            uVar62 = vcmpps_avx512vl(_local_2ce0,auVar77,1);
          } while ((char)uVar62 == '\0');
          uVar65 = (undefined4)uVar62;
          if (uVar67 < (uint)POPCOUNT(uVar65)) {
LAB_01d183e3:
            do {
              uVar62 = 8;
              auVar73 = auVar151._0_32_;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01d1984c;
                auVar48._4_4_ = uStack_273c;
                auVar48._0_4_ = local_2740;
                auVar48._8_4_ = uStack_2738;
                auVar48._12_4_ = uStack_2734;
                auVar48._16_4_ = uStack_2730;
                auVar48._20_4_ = uStack_272c;
                auVar48._24_4_ = uStack_2728;
                auVar48._28_4_ = uStack_2724;
                uVar20 = vcmpps_avx512vl(auVar132._0_32_,auVar48,9);
                if ((char)uVar20 != '\0') {
                  local_2bd0 = (ulong)((uint)root.ptr & 0xf) - 8;
                  uVar62 = root.ptr & 0xfffffffffffffff0;
                  bVar60 = ~(byte)local_2d94;
                  lVar55 = 0;
                  while (auVar73 = auVar151._0_32_, lVar55 != local_2bd0) {
                    local_2bc8 = lVar55;
                    lVar55 = lVar55 * 0x58;
                    auVar68._8_8_ = 0;
                    auVar68._0_8_ = *(ulong *)(uVar62 + 0x20 + lVar55);
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = *(ulong *)(uVar62 + 0x24 + lVar55);
                    uVar56 = vpcmpub_avx512vl(auVar68,auVar70,2);
                    if ((uVar56 & 0xf) != 0) {
                      lVar55 = lVar55 + uVar62;
                      uVar56 = (ulong)((byte)uVar56 & 0xf);
                      local_2c70 = lVar55;
                      do {
                        lVar22 = 0;
                        for (uVar53 = uVar56; (uVar53 & 1) == 0;
                            uVar53 = uVar53 >> 1 | 0x8000000000000000) {
                          lVar22 = lVar22 + 1;
                        }
                        auVar92._8_8_ = 0;
                        auVar92._0_8_ = *(ulong *)(lVar55 + 0x20);
                        auVar68 = vpmovzxbd_avx(auVar92);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        uVar65 = *(undefined4 *)(lVar55 + 0x44);
                        auVar100._4_4_ = uVar65;
                        auVar100._0_4_ = uVar65;
                        auVar100._8_4_ = uVar65;
                        auVar100._12_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar55 + 0x38);
                        auVar107._4_4_ = uVar65;
                        auVar107._0_4_ = uVar65;
                        auVar107._8_4_ = uVar65;
                        auVar107._12_4_ = uVar65;
                        auVar68 = vfmadd213ps_fma(auVar68,auVar100,auVar107);
                        local_2b20._0_16_ = auVar68;
                        auVar72._8_8_ = 0;
                        auVar72._0_8_ = *(ulong *)(lVar55 + 0x24);
                        auVar68 = vpmovzxbd_avx(auVar72);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        local_2710 = vfmadd213ps_fma(auVar68,auVar100,auVar107);
                        auVar71._8_8_ = 0;
                        auVar71._0_8_ = *(ulong *)(lVar55 + 0x28);
                        auVar68 = vpmovzxbd_avx(auVar71);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        uVar65 = *(undefined4 *)(lVar55 + 0x48);
                        auVar101._4_4_ = uVar65;
                        auVar101._0_4_ = uVar65;
                        auVar101._8_4_ = uVar65;
                        auVar101._12_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar55 + 0x3c);
                        auVar108._4_4_ = uVar65;
                        auVar108._0_4_ = uVar65;
                        auVar108._8_4_ = uVar65;
                        auVar108._12_4_ = uVar65;
                        local_29a0 = vfmadd213ps_fma(auVar68,auVar101,auVar108);
                        auVar69._8_8_ = 0;
                        auVar69._0_8_ = *(ulong *)(lVar55 + 0x2c);
                        auVar68 = vpmovzxbd_avx(auVar69);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        auVar68 = vfmadd213ps_fma(auVar68,auVar101,auVar108);
                        local_2d50.valid = (int *)auVar68._0_8_;
                        local_2d50.geometryUserPtr = (void *)auVar68._8_8_;
                        auVar93._8_8_ = 0;
                        auVar93._0_8_ = *(ulong *)(lVar55 + 0x30);
                        auVar68 = vpmovzxbd_avx(auVar93);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        uVar65 = *(undefined4 *)(lVar55 + 0x4c);
                        auVar102._4_4_ = uVar65;
                        auVar102._0_4_ = uVar65;
                        auVar102._8_4_ = uVar65;
                        auVar102._12_4_ = uVar65;
                        uVar65 = *(undefined4 *)(lVar55 + 0x40);
                        auVar109._4_4_ = uVar65;
                        auVar109._0_4_ = uVar65;
                        auVar109._8_4_ = uVar65;
                        auVar109._12_4_ = uVar65;
                        auVar68 = vfmadd213ps_fma(auVar68,auVar102,auVar109);
                        local_2c40._0_16_ = auVar68;
                        auVar94._8_8_ = 0;
                        auVar94._0_8_ = *(ulong *)(lVar55 + 0x34);
                        auVar68 = vpmovzxbd_avx(auVar94);
                        auVar68 = vcvtdq2ps_avx(auVar68);
                        local_2bc0._0_16_ = vfmadd213ps_fma(auVar68,auVar102,auVar109);
                        auVar45._4_4_ = fStack_281c;
                        auVar45._0_4_ = local_2820;
                        auVar45._8_4_ = fStack_2818;
                        auVar45._12_4_ = fStack_2814;
                        auVar45._16_4_ = fStack_2810;
                        auVar45._20_4_ = fStack_280c;
                        auVar45._24_4_ = fStack_2808;
                        auVar45._28_4_ = uStack_2804;
                        uVar53 = (ulong)(uint)((int)lVar22 * 4);
                        uVar65 = *(undefined4 *)((long)&local_2b20 + uVar53);
                        auVar115._4_4_ = uVar65;
                        auVar115._0_4_ = uVar65;
                        auVar115._8_4_ = uVar65;
                        auVar115._12_4_ = uVar65;
                        auVar115._16_4_ = uVar65;
                        auVar115._20_4_ = uVar65;
                        auVar115._24_4_ = uVar65;
                        auVar115._28_4_ = uVar65;
                        auVar68 = vfmsub132ps_fma(auVar115,auVar45,local_2880);
                        auVar46._4_4_ = fStack_27fc;
                        auVar46._0_4_ = local_2800;
                        auVar46._8_4_ = fStack_27f8;
                        auVar46._12_4_ = fStack_27f4;
                        auVar46._16_4_ = fStack_27f0;
                        auVar46._20_4_ = fStack_27ec;
                        auVar46._24_4_ = fStack_27e8;
                        auVar46._28_4_ = uStack_27e4;
                        uVar65 = *(undefined4 *)(local_29a0 + uVar53);
                        auVar123._4_4_ = uVar65;
                        auVar123._0_4_ = uVar65;
                        auVar123._8_4_ = uVar65;
                        auVar123._12_4_ = uVar65;
                        auVar123._16_4_ = uVar65;
                        auVar123._20_4_ = uVar65;
                        auVar123._24_4_ = uVar65;
                        auVar123._28_4_ = uVar65;
                        uVar65 = *(undefined4 *)(local_2c40 + uVar53);
                        auVar126._4_4_ = uVar65;
                        auVar126._0_4_ = uVar65;
                        auVar126._8_4_ = uVar65;
                        auVar126._12_4_ = uVar65;
                        auVar126._16_4_ = uVar65;
                        auVar126._20_4_ = uVar65;
                        auVar126._24_4_ = uVar65;
                        auVar126._28_4_ = uVar65;
                        auVar70 = vfmsub132ps_fma(auVar123,auVar46,local_2860);
                        auVar92 = vfmsub132ps_fma(auVar126,local_27e0,local_2840);
                        uVar65 = *(undefined4 *)(local_2710 + uVar53);
                        auVar23._4_4_ = uVar65;
                        auVar23._0_4_ = uVar65;
                        auVar23._8_4_ = uVar65;
                        auVar23._12_4_ = uVar65;
                        auVar23._16_4_ = uVar65;
                        auVar23._20_4_ = uVar65;
                        auVar23._24_4_ = uVar65;
                        auVar23._28_4_ = uVar65;
                        auVar78 = vfmsub132ps_avx512vl(local_2880,auVar45,auVar23);
                        uVar65 = *(undefined4 *)((long)&local_2d50.valid + uVar53);
                        auVar24._4_4_ = uVar65;
                        auVar24._0_4_ = uVar65;
                        auVar24._8_4_ = uVar65;
                        auVar24._12_4_ = uVar65;
                        auVar24._16_4_ = uVar65;
                        auVar24._20_4_ = uVar65;
                        auVar24._24_4_ = uVar65;
                        auVar24._28_4_ = uVar65;
                        auVar74 = vfmsub132ps_avx512vl(local_2860,auVar46,auVar24);
                        uVar65 = *(undefined4 *)((long)&local_2bc0 + uVar53);
                        auVar25._4_4_ = uVar65;
                        auVar25._0_4_ = uVar65;
                        auVar25._8_4_ = uVar65;
                        auVar25._12_4_ = uVar65;
                        auVar25._16_4_ = uVar65;
                        auVar25._20_4_ = uVar65;
                        auVar25._24_4_ = uVar65;
                        auVar25._28_4_ = uVar65;
                        auVar76 = vfmsub132ps_avx512vl(local_2840,local_27e0,auVar25);
                        auVar73 = vpminsd_avx2(ZEXT1632(auVar68),auVar78);
                        auVar75 = vpminsd_avx2(ZEXT1632(auVar70),auVar74);
                        auVar73 = vpmaxsd_avx2(auVar73,auVar75);
                        auVar75 = vpminsd_avx2(ZEXT1632(auVar92),auVar76);
                        auVar73 = vpmaxsd_avx2(auVar73,auVar75);
                        auVar75 = vpmaxsd_avx2(ZEXT1632(auVar68),auVar78);
                        auVar78 = vpmaxsd_avx2(ZEXT1632(auVar70),auVar74);
                        auVar78 = vpminsd_avx2(auVar75,auVar78);
                        auVar75 = vpmaxsd_avx2(ZEXT1632(auVar92),auVar76);
                        auVar75 = vpminsd_avx2(auVar78,auVar75);
                        auVar73 = vpmaxsd_avx2(auVar73,local_2760);
                        auVar49._4_4_ = uStack_273c;
                        auVar49._0_4_ = local_2740;
                        auVar49._8_4_ = uStack_2738;
                        auVar49._12_4_ = uStack_2734;
                        auVar49._16_4_ = uStack_2730;
                        auVar49._20_4_ = uStack_272c;
                        auVar49._24_4_ = uStack_2728;
                        auVar49._28_4_ = uStack_2724;
                        auVar75 = vpminsd_avx2(auVar75,auVar49);
                        uVar20 = vpcmpd_avx512vl(auVar73,auVar75,2);
                        if ((bVar60 & (byte)uVar20) == 0) {
                          bVar66 = false;
                        }
                        else {
                          local_2c68 = uVar56;
                          uVar4 = *(ushort *)(lVar55 + lVar22 * 8);
                          uVar5 = *(ushort *)(lVar55 + 2 + lVar22 * 8);
                          pGVar6 = (context->scene->geometries).items[*(uint *)(lVar55 + 0x50)].ptr;
                          local_2c78 = *(long *)&pGVar6->field_0x58;
                          local_2c80 = (ulong)*(uint *)(lVar55 + 4 + lVar22 * 8) *
                                       pGVar6[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i;
                          lVar22 = *(long *)&pGVar6[1].time_range.upper;
                          local_2d74 = uVar4 & 0x7fff;
                          local_2d78 = uVar5 & 0x7fff;
                          uVar122 = *(uint *)(local_2c78 + 4 + local_2c80);
                          uVar67 = (ulong)uVar122;
                          uVar53 = (ulong)(uVar122 * local_2d78 +
                                          *(int *)(local_2c78 + local_2c80) + local_2d74);
                          p_Var7 = pGVar6[1].intersectionFilterN;
                          puVar1 = (undefined8 *)(lVar22 + (uVar53 + 1) * (long)p_Var7);
                          local_2700 = *puVar1;
                          uStack_26f8 = puVar1[1];
                          lVar55 = uVar53 + uVar67;
                          local_26e0 = *(undefined1 (*) [16])(lVar22 + lVar55 * (long)p_Var7);
                          lVar63 = uVar53 + uVar67 + 1;
                          puVar1 = (undefined8 *)(lVar22 + lVar63 * (long)p_Var7);
                          local_26f0 = *puVar1;
                          uStack_26e8 = puVar1[1];
                          auVar68 = vpbroadcastd_avx512vl();
                          auVar132 = ZEXT1664(auVar68);
                          uVar56 = (ulong)(-1 < (short)uVar4);
                          lVar59 = uVar56 + lVar63;
                          puVar1 = (undefined8 *)(lVar22 + lVar59 * (long)p_Var7);
                          local_26b0 = *puVar1;
                          uStack_26a8 = puVar1[1];
                          if ((short)uVar5 < 0) {
                            uVar67 = 0;
                          }
                          puVar1 = (undefined8 *)(lVar22 + (lVar63 + uVar67) * (long)p_Var7);
                          local_2670 = *puVar1;
                          uStack_2668 = puVar1[1];
                          local_2710 = *(undefined1 (*) [16])(lVar22 + (long)p_Var7 * uVar53);
                          local_26d0 = local_2700;
                          uStack_26c8 = uStack_26f8;
                          local_26c0 = *(undefined1 (*) [16])
                                        (lVar22 + (uVar53 + uVar56 + 1) * (long)p_Var7);
                          local_26a0 = local_26f0;
                          uStack_2698 = uStack_26e8;
                          local_2690 = local_26e0;
                          local_2680 = local_26f0;
                          uStack_2678 = uStack_26e8;
                          local_2660 = *(undefined1 (*) [16])
                                        (lVar22 + (lVar55 + uVar67) * (long)p_Var7);
                          local_2650 = local_26f0;
                          uStack_2648 = uStack_26e8;
                          local_2640 = local_26b0;
                          uStack_2638 = uStack_26a8;
                          local_2630 = *(undefined1 (*) [16])
                                        (lVar22 + (uVar67 + lVar59) * (long)p_Var7);
                          local_2620 = local_2670;
                          uStack_2618 = uStack_2668;
                          auVar68 = vpbroadcastd_avx512vl();
                          auVar155 = ZEXT1664(auVar68);
                          pfVar64 = (float *)(local_26e0 + 8);
                          uVar67 = 0;
                          bVar57 = bVar60;
                          do {
                            auVar68 = auVar154._0_16_;
                            if (uVar67 == 4) goto LAB_01d196c6;
                            fVar91 = pfVar64[-0xe];
                            auVar103._4_4_ = fVar91;
                            auVar103._0_4_ = fVar91;
                            auVar103._8_4_ = fVar91;
                            auVar103._12_4_ = fVar91;
                            auVar103._16_4_ = fVar91;
                            auVar103._20_4_ = fVar91;
                            auVar103._24_4_ = fVar91;
                            auVar103._28_4_ = fVar91;
                            fVar97 = pfVar64[-0xd];
                            auVar120._4_4_ = fVar97;
                            auVar120._0_4_ = fVar97;
                            auVar120._8_4_ = fVar97;
                            auVar120._12_4_ = fVar97;
                            auVar120._16_4_ = fVar97;
                            auVar120._20_4_ = fVar97;
                            auVar120._24_4_ = fVar97;
                            auVar120._28_4_ = fVar97;
                            fVar98 = pfVar64[-0xc];
                            auVar129._4_4_ = fVar98;
                            auVar129._0_4_ = fVar98;
                            auVar129._8_4_ = fVar98;
                            auVar129._12_4_ = fVar98;
                            auVar129._16_4_ = fVar98;
                            auVar129._20_4_ = fVar98;
                            auVar129._24_4_ = fVar98;
                            auVar129._28_4_ = fVar98;
                            local_2d20 = pfVar64[-10];
                            local_2ce0._4_4_ = pfVar64[-9];
                            local_2cc0._4_4_ = pfVar64[-8];
                            auVar79 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-6]));
                            auVar80 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-5]));
                            auVar81 = vbroadcastss_avx512vl(ZEXT416((uint)pfVar64[-4]));
                            local_2c60 = pfVar64[-2];
                            local_2c00 = pfVar64[-1];
                            local_2c20 = *pfVar64;
                            local_2b90 = vmovdqa64_avx512vl(auVar155._0_16_);
                            local_2ba0 = vmovdqa64_avx512vl(auVar132._0_16_);
                            fStack_2d1c = local_2d20;
                            fStack_2d18 = local_2d20;
                            fStack_2d14 = local_2d20;
                            fStack_2d10 = local_2d20;
                            fStack_2d0c = local_2d20;
                            fStack_2d08 = local_2d20;
                            fStack_2d04 = local_2d20;
                            fVar140 = fVar91 - local_2d20;
                            auVar133._4_4_ = fVar140;
                            auVar133._0_4_ = fVar140;
                            auVar133._8_4_ = fVar140;
                            auVar133._12_4_ = fVar140;
                            auVar133._16_4_ = fVar140;
                            auVar133._20_4_ = fVar140;
                            auVar133._24_4_ = fVar140;
                            auVar133._28_4_ = fVar140;
                            local_2ce0._0_4_ = local_2ce0._4_4_;
                            fStack_2cd8 = (float)local_2ce0._4_4_;
                            fStack_2cd4 = (float)local_2ce0._4_4_;
                            fStack_2cd0 = (float)local_2ce0._4_4_;
                            fStack_2ccc = (float)local_2ce0._4_4_;
                            fStack_2cc8 = (float)local_2ce0._4_4_;
                            fStack_2cc4 = (float)local_2ce0._4_4_;
                            fVar99 = fVar97 - (float)local_2ce0._4_4_;
                            auVar138._4_4_ = fVar99;
                            auVar138._0_4_ = fVar99;
                            auVar138._8_4_ = fVar99;
                            auVar138._12_4_ = fVar99;
                            auVar138._16_4_ = fVar99;
                            auVar138._20_4_ = fVar99;
                            auVar138._24_4_ = fVar99;
                            auVar138._28_4_ = fVar99;
                            local_2cc0._0_4_ = local_2cc0._4_4_;
                            fStack_2cb8 = (float)local_2cc0._4_4_;
                            fStack_2cb4 = (float)local_2cc0._4_4_;
                            fStack_2cb0 = (float)local_2cc0._4_4_;
                            fStack_2cac = (float)local_2cc0._4_4_;
                            fStack_2ca8 = (float)local_2cc0._4_4_;
                            fStack_2ca4 = (float)local_2cc0._4_4_;
                            fVar139 = fVar98 - (float)local_2cc0._4_4_;
                            auVar144._4_4_ = fVar139;
                            auVar144._0_4_ = fVar139;
                            auVar144._8_4_ = fVar139;
                            auVar144._12_4_ = fVar139;
                            auVar144._16_4_ = fVar139;
                            auVar144._20_4_ = fVar139;
                            auVar144._24_4_ = fVar139;
                            auVar144._28_4_ = fVar139;
                            auVar146 = ZEXT436((uint)fVar139);
                            fStack_2c5c = local_2c60;
                            fStack_2c58 = local_2c60;
                            fStack_2c54 = local_2c60;
                            fStack_2c50 = local_2c60;
                            fStack_2c4c = local_2c60;
                            fStack_2c48 = local_2c60;
                            fStack_2c44 = local_2c60;
                            auVar82 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2c60 - fVar91)));
                            fStack_2bfc = local_2c00;
                            fStack_2bf8 = local_2c00;
                            fStack_2bf4 = local_2c00;
                            fStack_2bf0 = local_2c00;
                            fStack_2bec = local_2c00;
                            fStack_2be8 = local_2c00;
                            fStack_2be4 = local_2c00;
                            auVar83 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2c00 - fVar97)));
                            fStack_2c1c = local_2c20;
                            fStack_2c18 = local_2c20;
                            fStack_2c14 = local_2c20;
                            fStack_2c10 = local_2c20;
                            fStack_2c0c = local_2c20;
                            fStack_2c08 = local_2c20;
                            fStack_2c04 = local_2c20;
                            auVar84 = vbroadcastss_avx512vl(ZEXT416((uint)(local_2c20 - fVar98)));
                            auVar72 = auVar84._0_16_;
                            fVar99 = fVar99 * (local_2c20 - fVar98);
                            auVar124._4_4_ = fVar99;
                            auVar124._0_4_ = fVar99;
                            auVar124._8_4_ = fVar99;
                            auVar124._12_4_ = fVar99;
                            auVar124._16_4_ = fVar99;
                            auVar124._20_4_ = fVar99;
                            auVar124._24_4_ = fVar99;
                            auVar124._28_4_ = fVar99;
                            vVar85.field_0 =
                                 (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                 vfmsub231ps_avx512vl(auVar124,auVar83,auVar144);
                            fVar139 = fVar139 * (local_2c60 - fVar91);
                            auVar125._4_4_ = fVar139;
                            auVar125._0_4_ = fVar139;
                            auVar125._8_4_ = fVar139;
                            auVar125._12_4_ = fVar139;
                            auVar125._16_4_ = fVar139;
                            auVar125._20_4_ = fVar139;
                            auVar125._24_4_ = fVar139;
                            auVar125._28_4_ = fVar139;
                            local_2b20.field_0.y.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar125,auVar84,auVar133);
                            fVar140 = (local_2c00 - fVar97) * fVar140;
                            auVar127._4_4_ = fVar140;
                            auVar127._0_4_ = fVar140;
                            auVar127._8_4_ = fVar140;
                            auVar127._12_4_ = fVar140;
                            auVar127._16_4_ = fVar140;
                            auVar127._20_4_ = fVar140;
                            auVar127._24_4_ = fVar140;
                            auVar127._28_4_ = fVar140;
                            auVar73 = *(undefined1 (*) [32])ray;
                            auVar113 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                            auVar119 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                            auVar75 = *(undefined1 (*) [32])(ray + 0x80);
                            local_2b20.field_0.z.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar127,auVar82,auVar138);
                            auVar76 = vsubps_avx(auVar103,auVar73);
                            auVar77 = vsubps_avx(auVar120,*(undefined1 (*) [32])(ray + 0x20));
                            auVar89 = vsubps_avx(auVar129,*(undefined1 (*) [32])(ray + 0x40));
                            uVar122 = auVar89._28_4_;
                            auVar149 = ZEXT436(uVar122);
                            auVar148 = ZEXT436(uVar122);
                            auVar78 = *(undefined1 (*) [32])(ray + 0xa0);
                            auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
                            auVar86 = vmulps_avx512vl(auVar78,auVar89);
                            auVar86 = vfmsub231ps_avx512vl(auVar86,auVar77,auVar74);
                            auVar87 = vmulps_avx512vl(auVar74,auVar76);
                            auVar87 = vfmsub231ps_avx512vl(auVar87,auVar89,auVar75);
                            auVar70 = auVar87._0_16_;
                            auVar88 = vmulps_avx512vl(auVar75,auVar77);
                            auVar88 = vfmsub231ps_avx512vl(auVar88,auVar76,auVar78);
                            auVar92 = auVar88._0_16_;
                            auVar84 = vmulps_avx512vl(auVar84,auVar88);
                            auVar83 = vfmadd231ps_avx512vl(auVar84,auVar87,auVar83);
                            auVar84 = vmulps_avx512vl((undefined1  [32])local_2b20.field_0.z.field_0
                                                      ,auVar74);
                            auVar84 = vfmadd231ps_avx512vl
                                                (auVar84,(undefined1  [32])
                                                         local_2b20.field_0.y.field_0,auVar78);
                            auVar84 = vfmadd231ps_avx512vl
                                                (auVar84,(undefined1  [32])vVar85.field_0,auVar75);
                            auVar82 = vfmadd231ps_avx512vl(auVar83,auVar86,auVar82);
                            vandps_avx512vl(auVar84,auVar153._0_32_);
                            auVar83 = vxorps_avx512vl(auVar82,auVar82);
                            uVar20 = vcmpps_avx512vl(auVar83,auVar154._0_32_,5);
                            bVar51 = (byte)uVar20 & bVar57;
                            if (bVar51 != 0) {
                              auVar88 = vmulps_avx512vl(auVar144,auVar88);
                              auVar146 = ZEXT436(auVar88._28_4_);
                              auVar87 = vfmadd213ps_avx512vl(auVar87,auVar138,auVar88);
                              auVar70 = auVar87._0_16_;
                              auVar86 = vfmadd213ps_avx512vl(auVar86,auVar133,auVar87);
                              auVar87 = vxorps_avx512vl(auVar82,auVar86);
                              uVar20 = vcmpps_avx512vl(auVar87,auVar154._0_32_,5);
                              bVar51 = bVar51 & (byte)uVar20;
                              if (bVar51 != 0) {
                                vandps_avx512vl(auVar84,auVar150._0_32_);
                                auVar88 = vsubps_avx(auVar87,auVar83);
                                uVar3 = auVar88._28_4_;
                                auVar146 = ZEXT436(uVar3);
                                uVar20 = vcmpps_avx512vl(auVar88,auVar87,5);
                                bVar51 = bVar51 & (byte)uVar20;
                                if (bVar51 != 0) {
                                  local_2b80 = auVar81;
                                  local_2b60 = auVar80;
                                  local_2b40 = auVar79;
                                  local_2d70 = vmovdqa64_avx512vl(auVar155._0_16_);
                                  local_2d60 = vmovdqa64_avx512vl(auVar132._0_16_);
                                  auVar69 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
                                  auVar28._4_4_ = local_2b20._68_4_ * auVar89._4_4_;
                                  auVar28._0_4_ = local_2b20._64_4_ * auVar89._0_4_;
                                  auVar28._8_4_ = local_2b20._72_4_ * auVar89._8_4_;
                                  auVar28._12_4_ = local_2b20._76_4_ * auVar89._12_4_;
                                  auVar28._16_4_ = local_2b20._80_4_ * auVar89._16_4_;
                                  auVar28._20_4_ = local_2b20._84_4_ * auVar89._20_4_;
                                  auVar28._24_4_ = local_2b20._88_4_ * auVar89._24_4_;
                                  auVar28._28_4_ = uVar3;
                                  auVar71 = vfmadd213ps_fma(auVar77,(undefined1  [32])
                                                                    local_2b20.field_0.y.field_0,
                                                            auVar28);
                                  auVar71 = vfmadd213ps_fma(auVar76,(undefined1  [32])vVar85.field_0
                                                            ,ZEXT1632(auVar71));
                                  fVar91 = auVar87._0_4_;
                                  auVar142._0_4_ = fVar91 * *(float *)(ray + 0x60);
                                  fVar97 = auVar87._4_4_;
                                  auVar142._4_4_ = fVar97 * *(float *)(ray + 100);
                                  fVar98 = auVar87._8_4_;
                                  auVar142._8_4_ = fVar98 * *(float *)(ray + 0x68);
                                  fVar99 = auVar87._12_4_;
                                  auVar142._12_4_ = fVar99 * *(float *)(ray + 0x6c);
                                  fVar139 = auVar87._16_4_;
                                  auVar142._16_4_ = fVar139 * *(float *)(ray + 0x70);
                                  fVar140 = auVar87._20_4_;
                                  auVar142._20_4_ = fVar140 * *(float *)(ray + 0x74);
                                  fVar141 = auVar87._24_4_;
                                  auVar142._24_4_ = fVar141 * *(float *)(ray + 0x78);
                                  auVar142._28_4_ = 0;
                                  auVar76 = vxorps_avx512vl(auVar82,ZEXT1632(auVar71));
                                  auVar29._4_4_ = fVar97 * *(float *)(ray + 0x104);
                                  auVar29._0_4_ = fVar91 * *(float *)(ray + 0x100);
                                  auVar29._8_4_ = fVar98 * *(float *)(ray + 0x108);
                                  auVar29._12_4_ = fVar99 * *(float *)(ray + 0x10c);
                                  auVar29._16_4_ = fVar139 * *(float *)(ray + 0x110);
                                  auVar29._20_4_ = fVar140 * *(float *)(ray + 0x114);
                                  auVar29._24_4_ = fVar141 * *(float *)(ray + 0x118);
                                  auVar29._28_4_ = uVar3;
                                  auVar146 = ZEXT436(uVar3);
                                  uVar20 = vcmpps_avx512vl(auVar76,auVar29,2);
                                  uVar21 = vcmpps_avx512vl(auVar142,auVar76,1);
                                  bVar51 = bVar51 & (byte)uVar20 & (byte)uVar21;
                                  if (bVar51 == 0) {
LAB_01d18f89:
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                    auVar71 = vmovdqa64_avx512vl(local_2d60);
                                    auVar148 = ZEXT436(uVar122);
                                  }
                                  else {
                                    uVar20 = vcmpps_avx512vl(auVar84,ZEXT1632(auVar69),4);
                                    bVar51 = bVar51 & (byte)uVar20;
                                    if (bVar51 == 0) goto LAB_01d18f89;
                                    local_2a00._0_8_ =
                                         CONCAT44(0,*(uint *)(local_2b90 + uVar67 * 4));
                                    local_2cf8 = (context->scene->geometries).items
                                                 [CONCAT44(0,*(uint *)(local_2b90 + uVar67 * 4))].
                                                 ptr;
                                    uVar2 = local_2cf8->mask;
                                    auVar143._4_4_ = uVar2;
                                    auVar143._0_4_ = uVar2;
                                    auVar143._8_4_ = uVar2;
                                    auVar143._12_4_ = uVar2;
                                    auVar143._16_4_ = uVar2;
                                    auVar143._20_4_ = uVar2;
                                    auVar143._24_4_ = uVar2;
                                    auVar143._28_4_ = uVar2;
                                    uVar20 = vptestmd_avx512vl(auVar143,*(undefined1 (*) [32])
                                                                         (ray + 0x120));
                                    local_2d80._0_1_ = (byte)uVar20 & bVar51;
                                    if ((byte)local_2d80 == 0) goto LAB_01d18f89;
                                    local_2ce8 = *(undefined4 *)(local_2ba0 + uVar67 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (auVar146 = ZEXT436(uVar3),
                                       local_2cf8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar93 = auVar150._0_16_;
                                      auVar71 = vcvtsi2ss_avx512f(auVar93,*(ushort *)
                                                                           (local_2c78 + 8 +
                                                                           local_2c80) - 1);
                                      auVar33._12_4_ = 0;
                                      auVar33._0_12_ = ZEXT812(0);
                                      auVar69 = vrcp14ss_avx512f(auVar33 << 0x20,
                                                                 ZEXT416(auVar71._0_4_));
                                      auVar71 = vfnmadd213ss_fma(auVar71,auVar69,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar90 = auVar69._0_4_ * auVar71._0_4_;
                                      auVar71 = vcvtsi2ss_avx512f(auVar93,*(ushort *)
                                                                           (local_2c78 + 10 +
                                                                           local_2c80) - 1);
                                      auVar69 = vrcp14ss_avx512f(auVar33 << 0x20,
                                                                 ZEXT416(auVar71._0_4_));
                                      auVar71 = vfnmadd213ss_fma(auVar71,auVar69,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fStack_2a64 = auVar69._0_4_ * auVar71._0_4_;
                                      auVar71 = vcvtsi2ss_avx512f(auVar93,((uint)uVar67 & 1) +
                                                                          local_2d74);
                                      fVar106 = auVar71._0_4_;
                                      auVar111._0_4_ = auVar83._0_4_ + fVar91 * fVar106;
                                      auVar111._4_4_ = auVar83._4_4_ + fVar97 * fVar106;
                                      auVar111._8_4_ = auVar83._8_4_ + fVar98 * fVar106;
                                      auVar111._12_4_ = auVar83._12_4_ + fVar99 * fVar106;
                                      auVar111._16_4_ = auVar83._16_4_ + fVar139 * fVar106;
                                      auVar111._20_4_ = auVar83._20_4_ + fVar140 * fVar106;
                                      auVar111._24_4_ = auVar83._24_4_ + fVar141 * fVar106;
                                      auVar111._28_4_ = auVar83._28_4_ + fVar106;
                                      auVar95._4_4_ = fVar90;
                                      auVar95._0_4_ = fVar90;
                                      auVar95._8_4_ = fVar90;
                                      auVar95._12_4_ = fVar90;
                                      auVar95._16_4_ = fVar90;
                                      auVar95._20_4_ = fVar90;
                                      auVar95._24_4_ = fVar90;
                                      auVar95._28_4_ = fVar90;
                                      auVar73 = vmulps_avx512vl(auVar111,auVar95);
                                      bVar66 = (bool)(bVar51 >> 1 & 1);
                                      bVar10 = (bool)(bVar51 >> 2 & 1);
                                      bVar12 = (bool)(bVar51 >> 3 & 1);
                                      bVar16 = (bool)(bVar51 >> 4 & 1);
                                      bVar14 = (bool)(bVar51 >> 5 & 1);
                                      bVar17 = (bool)(bVar51 >> 6 & 1);
                                      auVar71 = vcvtsi2ss_avx512f(auVar93,((uint)(uVar67 >> 1) &
                                                                          0x7fffffff) + local_2d78);
                                      fVar90 = auVar71._0_4_;
                                      auVar96._0_4_ = fVar91 + fVar91 * fVar90;
                                      auVar96._4_4_ = fVar97 + fVar97 * fVar90;
                                      auVar96._8_4_ = fVar98 + fVar98 * fVar90;
                                      auVar96._12_4_ = fVar99 + fVar99 * fVar90;
                                      auVar96._16_4_ = fVar139 + fVar139 * fVar90;
                                      auVar96._20_4_ = fVar140 + fVar140 * fVar90;
                                      auVar96._24_4_ = fVar141 + fVar141 * fVar90;
                                      auVar96._28_4_ = auVar87._28_4_ + fVar90;
                                      auVar105._4_4_ = fStack_2a64;
                                      auVar105._0_4_ = fStack_2a64;
                                      auVar105._8_4_ = fStack_2a64;
                                      auVar105._12_4_ = fStack_2a64;
                                      auVar105._16_4_ = fStack_2a64;
                                      auVar105._20_4_ = fStack_2a64;
                                      auVar105._24_4_ = fStack_2a64;
                                      auVar105._28_4_ = fStack_2a64;
                                      auVar75 = vmulps_avx512vl(auVar96,auVar105);
                                      bVar9 = (bool)(bVar51 >> 1 & 1);
                                      bVar11 = (bool)(bVar51 >> 2 & 1);
                                      bVar13 = (bool)(bVar51 >> 3 & 1);
                                      bVar19 = (bool)(bVar51 >> 4 & 1);
                                      bVar15 = (bool)(bVar51 >> 5 & 1);
                                      bVar18 = (bool)(bVar51 >> 6 & 1);
                                      auVar78 = vrcp14ps_avx512vl(auVar87);
                                      auVar27._8_4_ = 0x3f800000;
                                      auVar27._0_8_ = 0x3f8000003f800000;
                                      auVar27._12_4_ = 0x3f800000;
                                      auVar27._16_4_ = 0x3f800000;
                                      auVar27._20_4_ = 0x3f800000;
                                      auVar27._24_4_ = 0x3f800000;
                                      auVar27._28_4_ = 0x3f800000;
                                      auVar74 = vfnmadd213ps_avx512vl(auVar87,auVar78,auVar27);
                                      auVar71 = vfmadd132ps_fma(auVar74,auVar78,auVar78);
                                      fVar90 = auVar71._0_4_;
                                      fVar106 = auVar71._4_4_;
                                      fVar128 = auVar71._8_4_;
                                      fVar134 = auVar71._12_4_;
                                      local_2ac0 = CONCAT44(fVar106 * auVar76._4_4_,
                                                            fVar90 * auVar76._0_4_);
                                      uStack_2ab8 = CONCAT44(fVar134 * auVar76._12_4_,
                                                             fVar128 * auVar76._8_4_);
                                      uStack_2ab0 = CONCAT44(auVar76._20_4_ * 0.0,
                                                             auVar76._16_4_ * 0.0);
                                      uStack_2aa8 = CONCAT44(auVar78._28_4_,auVar76._24_4_ * 0.0);
                                      local_2aa0._4_4_ =
                                           (float)((uint)bVar9 * auVar75._4_4_ |
                                                  (uint)!bVar9 * (int)fVar97) * fVar106;
                                      local_2aa0._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar75._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)fVar91) * fVar90;
                                      fStack_2a98 = (float)((uint)bVar11 * auVar75._8_4_ |
                                                           (uint)!bVar11 * (int)fVar98) * fVar128;
                                      fStack_2a94 = (float)((uint)bVar13 * auVar75._12_4_ |
                                                           (uint)!bVar13 * (int)fVar99) * fVar134;
                                      fStack_2a90 = (float)((uint)bVar19 * auVar75._16_4_ |
                                                           (uint)!bVar19 * (int)fVar139) * 0.0;
                                      fStack_2a8c = (float)((uint)bVar15 * auVar75._20_4_ |
                                                           (uint)!bVar15 * (int)fVar140) * 0.0;
                                      fStack_2a88 = (float)((uint)bVar18 * auVar75._24_4_ |
                                                           (uint)!bVar18 * (int)fVar141) * 0.0;
                                      fStack_2a84 = auVar111._28_4_;
                                      local_2a80._4_4_ =
                                           (float)((uint)bVar66 * auVar73._4_4_ |
                                                  (uint)!bVar66 * (int)auVar83._4_4_) * fVar106;
                                      local_2a80._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar73._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)auVar83._0_4_) *
                                           fVar90;
                                      fStack_2a78 = (float)((uint)bVar10 * auVar73._8_4_ |
                                                           (uint)!bVar10 * (int)auVar83._8_4_) *
                                                    fVar128;
                                      fStack_2a74 = (float)((uint)bVar12 * auVar73._12_4_ |
                                                           (uint)!bVar12 * (int)auVar83._12_4_) *
                                                    fVar134;
                                      fStack_2a70 = (float)((uint)bVar16 * auVar73._16_4_ |
                                                           (uint)!bVar16 * (int)auVar83._16_4_) *
                                                    0.0;
                                      fStack_2a6c = (float)((uint)bVar14 * auVar73._20_4_ |
                                                           (uint)!bVar14 * (int)auVar83._20_4_) *
                                                    0.0;
                                      fStack_2a68 = (float)((uint)bVar17 * auVar73._24_4_ |
                                                           (uint)!bVar17 * (int)auVar83._24_4_) *
                                                    0.0;
                                      local_2d50.valid = (int *)local_29a0;
                                      local_2d50.geometryUserPtr = &local_29e0;
                                      local_2d50.context = local_29c0;
                                      local_2d50.ray = (RTCRayN *)&local_2bc0;
                                      auVar146 = (undefined1  [36])0x0;
                                      auVar149 = (undefined1  [36])0x0;
                                      local_2b20.field_0.x.field_0 =
                                           (vfloat_impl<8>)(undefined1  [32])vVar85.field_0;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                  *)&local_2d50,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                  *)&local_2b20.field_0);
                                      pRVar8 = context->user;
                                      local_2a60 = vpbroadcastd_avx512vl();
                                      _local_2a80 = vpbroadcastd_avx512vl();
                                      local_2b20._16_8_ = uStack_2990;
                                      local_2b20._0_16_ = local_29a0;
                                      local_2b20._24_8_ = uStack_2988;
                                      local_2ac0 = local_2bc0._0_8_;
                                      uStack_2ab8 = local_2bc0._8_8_;
                                      uStack_2ab0 = local_2bc0._16_8_;
                                      uStack_2aa8 = local_2bc0._24_8_;
                                      auVar73 = vpcmpeqd_avx2(local_2a60,local_2a60);
                                      local_2c90[1] = auVar73;
                                      *local_2c90 = auVar73;
                                      local_2a40 = pRVar8->instID[0];
                                      uStack_2a3c = local_2a40;
                                      uStack_2a38 = local_2a40;
                                      uStack_2a34 = local_2a40;
                                      uStack_2a30 = local_2a40;
                                      uStack_2a2c = local_2a40;
                                      uStack_2a28 = local_2a40;
                                      uStack_2a24 = local_2a40;
                                      local_2a20 = pRVar8->instPrimID[0];
                                      uStack_2a1c = local_2a20;
                                      uStack_2a18 = local_2a20;
                                      uStack_2a14 = local_2a20;
                                      uStack_2a10 = local_2a20;
                                      uStack_2a0c = local_2a20;
                                      uStack_2a08 = local_2a20;
                                      uStack_2a04 = local_2a20;
                                      local_2a00 = *(undefined1 (*) [32])(ray + 0x100);
                                      auVar73 = vblendmps_avx512vl(local_2a00,
                                                                   (undefined1  [32])local_29e0);
                                      bVar66 = (bool)((byte)local_2d80 >> 1 & 1);
                                      bVar9 = (bool)((byte)local_2d80 >> 2 & 1);
                                      bVar10 = (bool)((byte)local_2d80 >> 3 & 1);
                                      bVar11 = (bool)((byte)local_2d80 >> 4 & 1);
                                      bVar12 = (bool)((byte)local_2d80 >> 5 & 1);
                                      bVar13 = (bool)((byte)local_2d80 >> 6 & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)((byte)local_2d80 & 1) * auVar73._0_4_ |
                                           (uint)!(bool)((byte)local_2d80 & 1) * local_2a00._0_4_;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar66 * auVar73._4_4_ |
                                           (uint)!bVar66 * local_2a00._4_4_;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar9 * auVar73._8_4_ |
                                           (uint)!bVar9 * local_2a00._8_4_;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar10 * auVar73._12_4_ |
                                           (uint)!bVar10 * local_2a00._12_4_;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar11 * auVar73._16_4_ |
                                           (uint)!bVar11 * local_2a00._16_4_;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar12 * auVar73._20_4_ |
                                           (uint)!bVar12 * local_2a00._20_4_;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar13 * auVar73._24_4_ |
                                           (uint)!bVar13 * local_2a00._24_4_;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)((byte)local_2d80 >> 7) * auVar73._28_4_ |
                                           (uint)!(bool)((byte)local_2d80 >> 7) * local_2a00._28_4_;
                                      local_2c40 = vpmovm2d_avx512vl((ulong)(byte)local_2d80);
                                      local_2d50.geometryUserPtr = local_2cf8->userPtr;
                                      local_2d50.valid = (int *)local_2c40;
                                      local_2d50.context = context->user;
                                      local_2d50.ray = (RTCRayN *)ray;
                                      local_2d50.hit = (RTCHitN *)&local_2b20;
                                      local_2d50.N = 8;
                                      if (local_2cf8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        auVar146 = (undefined1  [36])0x0;
                                        auVar149 = (undefined1  [36])0x0;
                                        (*local_2cf8->occlusionFilterN)(&local_2d50);
                                      }
                                      if (local_2c40 == (undefined1  [32])0x0) {
                                        local_2d80 = 0;
                                      }
                                      else {
                                        p_Var7 = context->args->filter;
                                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((local_2cf8->field_8).field_0x2 & 0x40) != 0)))) {
                                          auVar146 = (undefined1  [36])0x0;
                                          auVar149 = (undefined1  [36])0x0;
                                          (*p_Var7)(&local_2d50);
                                        }
                                        uVar56 = vptestmd_avx512vl(local_2c40,local_2c40);
                                        iVar52 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 4);
                                        iVar35 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 8);
                                        iVar36 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0xc)
                                        ;
                                        iVar37 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x10
                                                         );
                                        iVar38 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x14
                                                         );
                                        iVar39 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x18
                                                         );
                                        iVar40 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x1c
                                                         );
                                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar66 = (bool)((byte)uVar56 & 1);
                                        bVar9 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar11 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar19 = SUB81(uVar56 >> 7,0);
                                        local_2d80 = (uint)uVar56;
                                        *(uint *)(local_2d50.ray + 0x100) =
                                             (uint)bVar66 * auVar73._0_4_ |
                                             (uint)!bVar66 * *(int *)(local_2d50.ray + 0x100);
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 4) =
                                             (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * iVar52;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 8) =
                                             (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * iVar35;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0xc) =
                                             (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * iVar36;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x10) =
                                             (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * iVar37;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x14) =
                                             (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * iVar38;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x18) =
                                             (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * iVar39;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x1c) =
                                             (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * iVar40;
                                      }
                                      bVar66 = (bool)((byte)(local_2d80 >> 1) & 1);
                                      bVar9 = (bool)((byte)(local_2d80 >> 2) & 1);
                                      bVar10 = (bool)((byte)(local_2d80 >> 3) & 1);
                                      bVar11 = (bool)((byte)(local_2d80 >> 4) & 1);
                                      bVar12 = (bool)((byte)(local_2d80 >> 5) & 1);
                                      bVar13 = (bool)((byte)(local_2d80 >> 6) & 1);
                                      bVar16 = (bool)((byte)(local_2d80 >> 7) & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)((byte)local_2d80 & 1) * *(int *)(ray + 0x100) |
                                           (uint)!(bool)((byte)local_2d80 & 1) * local_2a00._0_4_;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar66 * *(int *)(ray + 0x104) |
                                           (uint)!bVar66 * local_2a00._4_4_;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar9 * *(int *)(ray + 0x108) |
                                           (uint)!bVar9 * local_2a00._8_4_;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar10 * *(int *)(ray + 0x10c) |
                                           (uint)!bVar10 * local_2a00._12_4_;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar11 * *(int *)(ray + 0x110) |
                                           (uint)!bVar11 * local_2a00._16_4_;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar12 * *(int *)(ray + 0x114) |
                                           (uint)!bVar12 * local_2a00._20_4_;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar13 * *(int *)(ray + 0x118) |
                                           (uint)!bVar13 * local_2a00._24_4_;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)bVar16 * *(int *)(ray + 0x11c) |
                                           (uint)!bVar16 * local_2a00._28_4_;
                                      auVar73 = *(undefined1 (*) [32])ray;
                                      auVar113 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x20));
                                      auVar119 = ZEXT3264(*(undefined1 (*) [32])(ray + 0x40));
                                      auVar75 = *(undefined1 (*) [32])(ray + 0x80);
                                      auVar78 = *(undefined1 (*) [32])(ray + 0xa0);
                                      auVar74 = *(undefined1 (*) [32])(ray + 0xc0);
                                    }
                                    bVar57 = bVar57 & ~(byte)local_2d80;
                                    auVar79 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar68 = vxorps_avx512vl(auVar68,auVar68);
                                    auVar71 = vmovdqa64_avx512vl(local_2d60);
                                    auVar148 = auVar149;
                                  }
                                  auVar132 = ZEXT1664(auVar71);
                                  auVar154 = ZEXT1664(auVar68);
                                  auVar153 = ZEXT3264(auVar77);
                                  auVar152 = ZEXT3264(auVar89);
                                  auVar151 = ZEXT3264(auVar76);
                                  auVar150 = ZEXT3264(auVar79);
                                  auVar68 = vmovdqa64_avx512vl(local_2d70);
                                  auVar155 = ZEXT1664(auVar68);
                                  auVar79 = local_2b40;
                                  auVar80 = local_2b60;
                                  auVar81 = local_2b80;
                                }
                              }
                            }
                            auVar94 = auVar154._0_16_;
                            auVar41._4_4_ = fStack_2d1c;
                            auVar41._0_4_ = local_2d20;
                            auVar41._8_4_ = fStack_2d18;
                            auVar41._12_4_ = fStack_2d14;
                            auVar41._16_4_ = fStack_2d10;
                            auVar41._20_4_ = fStack_2d0c;
                            auVar41._24_4_ = fStack_2d08;
                            auVar41._28_4_ = fStack_2d04;
                            auVar42._4_4_ = fStack_2c5c;
                            auVar42._0_4_ = local_2c60;
                            auVar42._8_4_ = fStack_2c58;
                            auVar42._12_4_ = fStack_2c54;
                            auVar42._16_4_ = fStack_2c50;
                            auVar42._20_4_ = fStack_2c4c;
                            auVar42._24_4_ = fStack_2c48;
                            auVar42._28_4_ = fStack_2c44;
                            auVar44._4_4_ = fStack_2bfc;
                            auVar44._0_4_ = local_2c00;
                            auVar44._8_4_ = fStack_2bf8;
                            auVar44._12_4_ = fStack_2bf4;
                            auVar44._16_4_ = fStack_2bf0;
                            auVar44._20_4_ = fStack_2bec;
                            auVar44._24_4_ = fStack_2be8;
                            auVar44._28_4_ = fStack_2be4;
                            auVar43._4_4_ = fStack_2c1c;
                            auVar43._0_4_ = local_2c20;
                            auVar43._8_4_ = fStack_2c18;
                            auVar43._12_4_ = fStack_2c14;
                            auVar43._16_4_ = fStack_2c10;
                            auVar43._20_4_ = fStack_2c0c;
                            auVar43._24_4_ = fStack_2c08;
                            auVar43._28_4_ = fStack_2c04;
                            auVar76 = vsubps_avx512vl(auVar79,auVar42);
                            auVar77 = vsubps_avx512vl(auVar80,auVar44);
                            auVar89 = vsubps_avx512vl(auVar81,auVar43);
                            auVar82 = vsubps_avx512vl(auVar41,auVar79);
                            auVar83 = vsubps_avx512vl(_local_2ce0,auVar80);
                            auVar84 = vsubps_avx512vl(_local_2cc0,auVar81);
                            auVar86 = vmulps_avx512vl(auVar77,auVar84);
                            vVar85.field_0 =
                                 (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                                 vfmsub231ps_avx512vl(auVar86,auVar83,auVar89);
                            auVar86 = vmulps_avx512vl(auVar89,auVar82);
                            local_2b20.field_0.y.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar86,auVar84,auVar76);
                            auVar86 = vmulps_avx512vl(auVar76,auVar83);
                            local_2b20.field_0.z.field_0 =
                                 (vfloat_impl<8>)vfmsub231ps_avx512vl(auVar86,auVar82,auVar77);
                            auVar73 = vsubps_avx512vl(auVar79,auVar73);
                            auVar79 = vsubps_avx512vl(auVar80,auVar113._0_32_);
                            auVar80 = vsubps_avx512vl(auVar81,auVar119._0_32_);
                            fVar90 = auVar80._0_4_;
                            auVar114._0_4_ = fVar90 * auVar78._0_4_;
                            fVar106 = auVar80._4_4_;
                            auVar114._4_4_ = fVar106 * auVar78._4_4_;
                            fVar128 = auVar80._8_4_;
                            auVar114._8_4_ = fVar128 * auVar78._8_4_;
                            fVar134 = auVar80._12_4_;
                            auVar114._12_4_ = fVar134 * auVar78._12_4_;
                            fVar135 = auVar80._16_4_;
                            auVar114._16_4_ = fVar135 * auVar78._16_4_;
                            fVar136 = auVar80._20_4_;
                            auVar114._20_4_ = fVar136 * auVar78._20_4_;
                            auVar114._28_36_ = auVar113._28_36_;
                            fVar137 = auVar80._24_4_;
                            auVar114._24_4_ = fVar137 * auVar78._24_4_;
                            auVar71 = vfmsub231ps_fma(auVar114._0_32_,auVar79,auVar74);
                            auVar145._0_4_ = auVar74._0_4_ * auVar73._0_4_;
                            auVar145._4_4_ = auVar74._4_4_ * auVar73._4_4_;
                            auVar145._8_4_ = auVar74._8_4_ * auVar73._8_4_;
                            auVar145._12_4_ = auVar74._12_4_ * auVar73._12_4_;
                            auVar145._16_4_ = auVar74._16_4_ * auVar73._16_4_;
                            auVar145._20_4_ = auVar74._20_4_ * auVar73._20_4_;
                            auVar145._24_4_ = auVar74._24_4_ * auVar73._24_4_;
                            auVar145._28_36_ = auVar146;
                            auVar69 = vfmsub231ps_fma(auVar145._0_32_,auVar80,auVar75);
                            auVar147._0_4_ = auVar79._0_4_ * auVar75._0_4_;
                            auVar147._4_4_ = auVar79._4_4_ * auVar75._4_4_;
                            auVar147._8_4_ = auVar79._8_4_ * auVar75._8_4_;
                            auVar147._12_4_ = auVar79._12_4_ * auVar75._12_4_;
                            auVar147._16_4_ = auVar79._16_4_ * auVar75._16_4_;
                            auVar147._20_4_ = auVar79._20_4_ * auVar75._20_4_;
                            auVar147._24_4_ = auVar79._24_4_ * auVar75._24_4_;
                            auVar147._28_36_ = auVar148;
                            auVar93 = vfmsub231ps_fma(auVar147._0_32_,auVar73,auVar78);
                            auVar113._0_4_ = local_2b20._64_4_ * auVar74._0_4_;
                            auVar113._4_4_ = local_2b20._68_4_ * auVar74._4_4_;
                            auVar113._8_4_ = local_2b20._72_4_ * auVar74._8_4_;
                            auVar113._12_4_ = local_2b20._76_4_ * auVar74._12_4_;
                            auVar113._16_4_ = local_2b20._80_4_ * auVar74._16_4_;
                            auVar113._20_4_ = local_2b20._84_4_ * auVar74._20_4_;
                            auVar113._28_36_ = auVar119._28_36_;
                            auVar113._24_4_ = local_2b20._88_4_ * auVar74._24_4_;
                            auVar68 = vfmadd231ps_fma(auVar113._0_32_,
                                                      (undefined1  [32])local_2b20.field_0.y.field_0
                                                      ,auVar78);
                            auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),
                                                      (undefined1  [32])vVar85.field_0,auVar75);
                            vandps_avx512vl(ZEXT1632(auVar68),auVar153._0_32_);
                            auVar75 = vmulps_avx512vl(auVar84,ZEXT1632(auVar93));
                            auVar75 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar69),auVar83);
                            auVar75 = vfmadd231ps_avx512vl(auVar75,ZEXT1632(auVar71),auVar82);
                            fVar91 = auVar75._0_4_;
                            auVar104._0_4_ = (uint)fVar90 ^ (uint)fVar91;
                            fVar97 = auVar75._4_4_;
                            auVar104._4_4_ = (uint)fVar106 ^ (uint)fVar97;
                            fVar98 = auVar75._8_4_;
                            auVar104._8_4_ = (uint)fVar128 ^ (uint)fVar98;
                            fVar99 = auVar75._12_4_;
                            auVar104._12_4_ = (uint)fVar134 ^ (uint)fVar99;
                            fVar139 = auVar75._16_4_;
                            auVar104._16_4_ = (uint)fVar135 ^ (uint)fVar139;
                            fVar140 = auVar75._20_4_;
                            auVar104._20_4_ = (uint)fVar136 ^ (uint)fVar140;
                            fVar141 = auVar75._24_4_;
                            auVar104._24_4_ = (uint)fVar137 ^ (uint)fVar141;
                            uVar122 = auVar80._28_4_;
                            auVar104._28_4_ = uVar122 ^ auVar75._28_4_;
                            uVar20 = vcmpps_avx512vl(auVar104,auVar154._0_32_,5);
                            bVar51 = (byte)uVar20 & bVar57;
                            if (bVar51 != 0) {
                              auVar30._4_4_ = auVar89._4_4_ * auVar93._4_4_;
                              auVar30._0_4_ = auVar89._0_4_ * auVar93._0_4_;
                              auVar30._8_4_ = auVar89._8_4_ * auVar93._8_4_;
                              auVar30._12_4_ = auVar89._12_4_ * auVar93._12_4_;
                              auVar30._16_4_ = auVar89._16_4_ * 0.0;
                              auVar30._20_4_ = auVar89._20_4_ * 0.0;
                              auVar30._24_4_ = auVar89._24_4_ * 0.0;
                              auVar30._28_4_ = auVar75._28_4_;
                              auVar69 = vfmadd213ps_fma(ZEXT1632(auVar69),auVar77,auVar30);
                              auVar71 = vfmadd213ps_fma(ZEXT1632(auVar71),auVar76,ZEXT1632(auVar69))
                              ;
                              auVar112._0_4_ = (uint)fVar90 ^ auVar71._0_4_;
                              auVar112._4_4_ = (uint)fVar106 ^ auVar71._4_4_;
                              auVar112._8_4_ = (uint)fVar128 ^ auVar71._8_4_;
                              auVar112._12_4_ = (uint)fVar134 ^ auVar71._12_4_;
                              auVar112._16_4_ = fVar135;
                              auVar112._20_4_ = fVar136;
                              auVar112._24_4_ = fVar137;
                              auVar112._28_4_ = uVar122;
                              uVar20 = vcmpps_avx512vl(auVar112,auVar154._0_32_,5);
                              bVar51 = bVar51 & (byte)uVar20;
                              if (bVar51 != 0) {
                                vandps_avx512vl(ZEXT1632(auVar68),auVar150._0_32_);
                                auVar78 = vsubps_avx(auVar75,auVar104);
                                uVar20 = vcmpps_avx512vl(auVar78,auVar112,5);
                                bVar51 = bVar51 & (byte)uVar20;
                                if (bVar51 != 0) {
                                  local_2d70 = vmovdqa64_avx512vl(auVar155._0_16_);
                                  local_2d60 = vmovdqa64_avx512vl(auVar132._0_16_);
                                  auVar31._4_4_ = local_2b20._68_4_ * fVar106;
                                  auVar31._0_4_ = local_2b20._64_4_ * fVar90;
                                  auVar31._8_4_ = local_2b20._72_4_ * fVar128;
                                  auVar31._12_4_ = local_2b20._76_4_ * fVar134;
                                  auVar31._16_4_ = local_2b20._80_4_ * fVar135;
                                  auVar31._20_4_ = local_2b20._84_4_ * fVar136;
                                  auVar31._24_4_ = local_2b20._88_4_ * fVar137;
                                  auVar31._28_4_ = uVar122;
                                  auVar71 = vfmadd213ps_fma(auVar79,(undefined1  [32])
                                                                    local_2b20.field_0.y.field_0,
                                                            auVar31);
                                  auVar71 = vfmadd213ps_fma(auVar73,(undefined1  [32])vVar85.field_0
                                                            ,ZEXT1632(auVar71));
                                  auVar130._0_4_ = fVar91 * *(float *)(ray + 0x60);
                                  auVar130._4_4_ = fVar97 * *(float *)(ray + 100);
                                  auVar130._8_4_ = fVar98 * *(float *)(ray + 0x68);
                                  auVar130._12_4_ = fVar99 * *(float *)(ray + 0x6c);
                                  auVar130._16_4_ = fVar139 * *(float *)(ray + 0x70);
                                  auVar130._20_4_ = fVar140 * *(float *)(ray + 0x74);
                                  auVar130._24_4_ = fVar141 * *(float *)(ray + 0x78);
                                  auVar130._28_4_ = 0;
                                  auVar110._0_4_ = (float)((uint)fVar90 ^ auVar71._0_4_);
                                  auVar110._4_4_ = (float)((uint)fVar106 ^ auVar71._4_4_);
                                  auVar110._8_4_ = (float)((uint)fVar128 ^ auVar71._8_4_);
                                  auVar110._12_4_ = (float)((uint)fVar134 ^ auVar71._12_4_);
                                  auVar110._16_4_ = fVar135;
                                  auVar110._20_4_ = fVar136;
                                  auVar110._24_4_ = fVar137;
                                  auVar110._28_4_ = uVar122;
                                  auVar32._4_4_ = fVar97 * *(float *)(ray + 0x104);
                                  auVar32._0_4_ = fVar91 * *(float *)(ray + 0x100);
                                  auVar32._8_4_ = fVar98 * *(float *)(ray + 0x108);
                                  auVar32._12_4_ = fVar99 * *(float *)(ray + 0x10c);
                                  auVar32._16_4_ = fVar139 * *(float *)(ray + 0x110);
                                  auVar32._20_4_ = fVar140 * *(float *)(ray + 0x114);
                                  auVar32._24_4_ = fVar141 * *(float *)(ray + 0x118);
                                  auVar32._28_4_ = uVar122;
                                  uVar20 = vcmpps_avx512vl(auVar110,auVar32,2);
                                  uVar21 = vcmpps_avx512vl(auVar130,auVar110,1);
                                  bVar51 = bVar51 & (byte)uVar20 & (byte)uVar21;
                                  if (bVar51 == 0) {
LAB_01d18fd2:
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar68 = vxorps_avx512vl(auVar94,auVar94);
                                    auVar70 = vmovdqa64_avx512vl(local_2d60);
                                  }
                                  else {
                                    uVar20 = vcmpps_avx512vl(ZEXT1632(auVar68),ZEXT832(0) << 0x20,4)
                                    ;
                                    bVar51 = bVar51 & (byte)uVar20;
                                    if (bVar51 == 0) goto LAB_01d18fd2;
                                    local_2cc0 = (undefined1  [8])
                                                 CONCAT44(0,*(uint *)(local_2b90 + uVar67 * 4));
                                    pGVar6 = (context->scene->geometries).items
                                             [CONCAT44(0,*(uint *)(local_2b90 + uVar67 * 4))].ptr;
                                    local_2ce0 = (undefined1  [8])pGVar6;
                                    uVar3 = pGVar6->mask;
                                    auVar116._4_4_ = uVar3;
                                    auVar116._0_4_ = uVar3;
                                    auVar116._8_4_ = uVar3;
                                    auVar116._12_4_ = uVar3;
                                    auVar116._16_4_ = uVar3;
                                    auVar116._20_4_ = uVar3;
                                    auVar116._24_4_ = uVar3;
                                    auVar116._28_4_ = uVar3;
                                    uVar20 = vptestmd_avx512vl(auVar116,*(undefined1 (*) [32])
                                                                         (ray + 0x120));
                                    bVar54 = (byte)uVar20 & bVar51;
                                    local_2d20 = (float)(uint)bVar54;
                                    if (bVar54 == 0) goto LAB_01d18fd2;
                                    local_2c60 = *(float *)(local_2ba0 + uVar67 * 4);
                                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                       (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                      auVar73 = vsubps_avx(auVar75,auVar112);
                                      auVar68 = vcvtsi2ss_avx512f(auVar72,*(ushort *)
                                                                           (local_2c78 + 8 +
                                                                           local_2c80) - 1);
                                      auVar34._12_4_ = 0;
                                      auVar34._0_12_ = ZEXT812(0);
                                      auVar71 = vrcp14ss_avx512f(auVar34 << 0x20,
                                                                 ZEXT416(auVar68._0_4_));
                                      auVar68 = vfnmadd213ss_fma(auVar68,auVar71,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar90 = auVar71._0_4_ * auVar68._0_4_;
                                      auVar68 = vcvtsi2ss_avx512f(auVar72,*(ushort *)
                                                                           (local_2c78 + 10 +
                                                                           local_2c80) - 1);
                                      auVar72 = vrcp14ss_avx512f(auVar34 << 0x20,
                                                                 ZEXT416(auVar68._0_4_));
                                      auVar68 = vfnmadd213ss_fma(auVar68,auVar72,
                                                                 SUB6416(ZEXT464(0x40000000),0));
                                      fVar106 = auVar72._0_4_ * auVar68._0_4_;
                                      auVar68 = vcvtsi2ss_avx512f(auVar92,((uint)uVar67 & 1) +
                                                                          local_2d74);
                                      fVar128 = auVar68._0_4_;
                                      auVar131._0_4_ = fVar128 * fVar91 + auVar78._0_4_;
                                      auVar131._4_4_ = fVar128 * fVar97 + auVar78._4_4_;
                                      auVar131._8_4_ = fVar128 * fVar98 + auVar78._8_4_;
                                      auVar131._12_4_ = fVar128 * fVar99 + auVar78._12_4_;
                                      auVar131._16_4_ = fVar128 * fVar139 + auVar78._16_4_;
                                      auVar131._20_4_ = fVar128 * fVar140 + auVar78._20_4_;
                                      auVar131._24_4_ = fVar128 * fVar141 + auVar78._24_4_;
                                      auVar131._28_4_ = fVar128 + auVar78._28_4_;
                                      auVar117._4_4_ = fVar90;
                                      auVar117._0_4_ = fVar90;
                                      auVar117._8_4_ = fVar90;
                                      auVar117._12_4_ = fVar90;
                                      auVar117._16_4_ = fVar90;
                                      auVar117._20_4_ = fVar90;
                                      auVar117._24_4_ = fVar90;
                                      auVar117._28_4_ = fVar90;
                                      auVar74 = vmulps_avx512vl(auVar131,auVar117);
                                      bVar66 = (bool)(bVar51 >> 1 & 1);
                                      bVar10 = (bool)(bVar51 >> 2 & 1);
                                      bVar12 = (bool)(bVar51 >> 3 & 1);
                                      bVar16 = (bool)(bVar51 >> 4 & 1);
                                      bVar14 = (bool)(bVar51 >> 5 & 1);
                                      bVar17 = (bool)(bVar51 >> 6 & 1);
                                      auVar68 = vcvtsi2ss_avx512f(auVar70,((uint)(uVar67 >> 1) &
                                                                          0x7fffffff) + local_2d78);
                                      fVar90 = auVar68._0_4_;
                                      auVar118._0_4_ = auVar73._0_4_ + fVar90 * fVar91;
                                      auVar118._4_4_ = auVar73._4_4_ + fVar90 * fVar97;
                                      auVar118._8_4_ = auVar73._8_4_ + fVar90 * fVar98;
                                      auVar118._12_4_ = auVar73._12_4_ + fVar90 * fVar99;
                                      auVar118._16_4_ = auVar73._16_4_ + fVar90 * fVar139;
                                      auVar118._20_4_ = auVar73._20_4_ + fVar90 * fVar140;
                                      auVar118._24_4_ = auVar73._24_4_ + fVar90 * fVar141;
                                      auVar118._28_4_ = auVar73._28_4_ + fVar90;
                                      auVar121._4_4_ = fVar106;
                                      auVar121._0_4_ = fVar106;
                                      auVar121._8_4_ = fVar106;
                                      auVar121._12_4_ = fVar106;
                                      auVar121._16_4_ = fVar106;
                                      auVar121._20_4_ = fVar106;
                                      auVar121._24_4_ = fVar106;
                                      auVar121._28_4_ = fVar106;
                                      auVar76 = vmulps_avx512vl(auVar118,auVar121);
                                      bVar9 = (bool)(bVar51 >> 1 & 1);
                                      bVar11 = (bool)(bVar51 >> 2 & 1);
                                      bVar13 = (bool)(bVar51 >> 3 & 1);
                                      bVar19 = (bool)(bVar51 >> 4 & 1);
                                      bVar15 = (bool)(bVar51 >> 5 & 1);
                                      bVar18 = (bool)(bVar51 >> 6 & 1);
                                      auVar77 = vrcp14ps_avx512vl(auVar75);
                                      auVar26._8_4_ = 0x3f800000;
                                      auVar26._0_8_ = 0x3f8000003f800000;
                                      auVar26._12_4_ = 0x3f800000;
                                      auVar26._16_4_ = 0x3f800000;
                                      auVar26._20_4_ = 0x3f800000;
                                      auVar26._24_4_ = 0x3f800000;
                                      auVar26._28_4_ = 0x3f800000;
                                      auVar75 = vfnmadd213ps_avx512vl(auVar75,auVar77,auVar26);
                                      auVar68 = vfmadd132ps_fma(auVar75,auVar77,auVar77);
                                      fVar91 = auVar68._0_4_;
                                      fVar97 = auVar68._4_4_;
                                      fVar98 = auVar68._8_4_;
                                      fVar99 = auVar68._12_4_;
                                      local_2aa0._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar76._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)auVar73._0_4_) *
                                           fVar91;
                                      local_2aa0._4_4_ =
                                           (float)((uint)bVar9 * auVar76._4_4_ |
                                                  (uint)!bVar9 * (int)auVar73._4_4_) * fVar97;
                                      fStack_2a98 = (float)((uint)bVar11 * auVar76._8_4_ |
                                                           (uint)!bVar11 * (int)auVar73._8_4_) *
                                                    fVar98;
                                      fStack_2a94 = (float)((uint)bVar13 * auVar76._12_4_ |
                                                           (uint)!bVar13 * (int)auVar73._12_4_) *
                                                    fVar99;
                                      fStack_2a90 = (float)((uint)bVar19 * auVar76._16_4_ |
                                                           (uint)!bVar19 * (int)auVar73._16_4_) *
                                                    0.0;
                                      fStack_2a8c = (float)((uint)bVar15 * auVar76._20_4_ |
                                                           (uint)!bVar15 * (int)auVar73._20_4_) *
                                                    0.0;
                                      fStack_2a88 = (float)((uint)bVar18 * auVar76._24_4_ |
                                                           (uint)!bVar18 * (int)auVar73._24_4_) *
                                                    0.0;
                                      fStack_2a84 = 0.0;
                                      local_2ac0 = CONCAT44(fVar97 * auVar110._4_4_,
                                                            fVar91 * auVar110._0_4_);
                                      uStack_2ab8 = CONCAT44(fVar99 * auVar110._12_4_,
                                                             fVar98 * auVar110._8_4_);
                                      uStack_2ab0 = CONCAT44(fVar136 * 0.0,fVar135 * 0.0);
                                      uStack_2aa8 = CONCAT44(uVar122,fVar137 * 0.0);
                                      local_2a80._4_4_ =
                                           (float)((uint)bVar66 * auVar74._4_4_ |
                                                  (uint)!bVar66 * (int)auVar78._4_4_) * fVar97;
                                      local_2a80._0_4_ =
                                           (float)((uint)(bVar51 & 1) * auVar74._0_4_ |
                                                  (uint)!(bool)(bVar51 & 1) * (int)auVar78._0_4_) *
                                           fVar91;
                                      fStack_2a78 = (float)((uint)bVar10 * auVar74._8_4_ |
                                                           (uint)!bVar10 * (int)auVar78._8_4_) *
                                                    fVar98;
                                      fStack_2a74 = (float)((uint)bVar12 * auVar74._12_4_ |
                                                           (uint)!bVar12 * (int)auVar78._12_4_) *
                                                    fVar99;
                                      fStack_2a70 = (float)((uint)bVar16 * auVar74._16_4_ |
                                                           (uint)!bVar16 * (int)auVar78._16_4_) *
                                                    0.0;
                                      fStack_2a6c = (float)((uint)bVar14 * auVar74._20_4_ |
                                                           (uint)!bVar14 * (int)auVar78._20_4_) *
                                                    0.0;
                                      fStack_2a68 = (float)((uint)bVar17 * auVar74._24_4_ |
                                                           (uint)!bVar17 * (int)auVar78._24_4_) *
                                                    0.0;
                                      fStack_2a64 = (float)((uint)(bVar51 >> 7) * auVar74._28_4_ |
                                                           (uint)!(bool)(bVar51 >> 7) *
                                                           (int)auVar78._28_4_);
                                      local_2d50.valid = (int *)local_29a0;
                                      local_2d50.geometryUserPtr = &local_29e0;
                                      local_2d50.context = local_29c0;
                                      local_2d50.ray = (RTCRayN *)&local_2bc0;
                                      local_2b20.field_0.x.field_0 =
                                           (vfloat_impl<8>)(undefined1  [32])vVar85.field_0;
                                      std::
                                      _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                                      ::
                                      _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                                                ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                                                  *)&local_2d50,
                                                 (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                                                  *)&local_2b20.field_0);
                                      pRVar8 = context->user;
                                      local_2a60 = vpbroadcastd_avx512vl();
                                      _local_2a80 = vpbroadcastd_avx512vl();
                                      local_2b20._16_8_ = uStack_2990;
                                      local_2b20._0_16_ = local_29a0;
                                      local_2b20._24_8_ = uStack_2988;
                                      local_2ac0 = local_2bc0._0_8_;
                                      uStack_2ab8 = local_2bc0._8_8_;
                                      uStack_2ab0 = local_2bc0._16_8_;
                                      uStack_2aa8 = local_2bc0._24_8_;
                                      auVar73 = vpcmpeqd_avx2(local_2a60,local_2a60);
                                      local_2c90[1] = auVar73;
                                      *local_2c90 = auVar73;
                                      local_2a40 = pRVar8->instID[0];
                                      uStack_2a3c = local_2a40;
                                      uStack_2a38 = local_2a40;
                                      uStack_2a34 = local_2a40;
                                      uStack_2a30 = local_2a40;
                                      uStack_2a2c = local_2a40;
                                      uStack_2a28 = local_2a40;
                                      uStack_2a24 = local_2a40;
                                      local_2a20 = pRVar8->instPrimID[0];
                                      uStack_2a1c = local_2a20;
                                      uStack_2a18 = local_2a20;
                                      uStack_2a14 = local_2a20;
                                      uStack_2a10 = local_2a20;
                                      uStack_2a0c = local_2a20;
                                      uStack_2a08 = local_2a20;
                                      uStack_2a04 = local_2a20;
                                      _local_2cc0 = *(undefined1 (*) [32])(ray + 0x100);
                                      auVar73 = vblendmps_avx512vl(_local_2cc0,
                                                                   (undefined1  [32])local_29e0);
                                      bVar66 = (bool)(SUB41(local_2d20,0) & 1);
                                      bVar9 = (bool)((byte)((uint)local_2d20 >> 1) & 1);
                                      bVar10 = (bool)((byte)((uint)local_2d20 >> 2) & 1);
                                      bVar11 = (bool)((byte)((uint)local_2d20 >> 3) & 1);
                                      bVar12 = (bool)((byte)((uint)local_2d20 >> 4) & 1);
                                      bVar13 = (bool)((byte)((uint)local_2d20 >> 5) & 1);
                                      bVar16 = (bool)((byte)((uint)local_2d20 >> 6) & 1);
                                      bVar19 = (bool)((byte)((uint)local_2d20 >> 7) & 1);
                                      *(uint *)(ray + 0x100) =
                                           (uint)bVar66 * auVar73._0_4_ |
                                           (uint)!bVar66 * local_2cc0._0_4_;
                                      *(uint *)(ray + 0x104) =
                                           (uint)bVar9 * auVar73._4_4_ |
                                           (uint)!bVar9 * local_2cc0._4_4_;
                                      *(uint *)(ray + 0x108) =
                                           (uint)bVar10 * auVar73._8_4_ |
                                           (uint)!bVar10 * local_2cc0._8_4_;
                                      *(uint *)(ray + 0x10c) =
                                           (uint)bVar11 * auVar73._12_4_ |
                                           (uint)!bVar11 * local_2cc0._12_4_;
                                      *(uint *)(ray + 0x110) =
                                           (uint)bVar12 * auVar73._16_4_ |
                                           (uint)!bVar12 * local_2cc0._16_4_;
                                      *(uint *)(ray + 0x114) =
                                           (uint)bVar13 * auVar73._20_4_ |
                                           (uint)!bVar13 * local_2cc0._20_4_;
                                      *(uint *)(ray + 0x118) =
                                           (uint)bVar16 * auVar73._24_4_ |
                                           (uint)!bVar16 * local_2cc0._24_4_;
                                      *(uint *)(ray + 0x11c) =
                                           (uint)bVar19 * auVar73._28_4_ |
                                           (uint)!bVar19 * local_2cc0._28_4_;
                                      local_2c40 = vpmovm2d_avx512vl((ulong)(uint)local_2d20);
                                      local_2d50.geometryUserPtr =
                                           (void *)*(undefined8 *)((long)local_2ce0 + 0x18);
                                      local_2d50.valid = (int *)local_2c40;
                                      local_2d50.context = context->user;
                                      local_2d50.ray = (RTCRayN *)ray;
                                      local_2d50.hit = (RTCHitN *)&local_2b20;
                                      local_2d50.N = 8;
                                      if (*(code **)((long)local_2ce0 + 0x48) != (code *)0x0) {
                                        (**(code **)((long)local_2ce0 + 0x48))(&local_2d50);
                                      }
                                      if (local_2c40 == (undefined1  [32])0x0) {
                                        local_2d20 = 0.0;
                                      }
                                      else {
                                        p_Var7 = context->args->filter;
                                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                           (((context->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            ((*(byte *)((long)local_2ce0 + 0x3e) & 0x40) != 0)))) {
                                          (*p_Var7)(&local_2d50);
                                        }
                                        uVar56 = vptestmd_avx512vl(local_2c40,local_2c40);
                                        iVar52 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 4);
                                        iVar35 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 8);
                                        iVar36 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0xc)
                                        ;
                                        iVar37 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x10
                                                         );
                                        iVar38 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x14
                                                         );
                                        iVar39 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x18
                                                         );
                                        iVar40 = *(int *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x1c
                                                         );
                                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                        bVar66 = (bool)((byte)uVar56 & 1);
                                        bVar9 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar10 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar11 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar19 = SUB81(uVar56 >> 7,0);
                                        local_2d20 = (float)(uint)uVar56;
                                        *(uint *)(local_2d50.ray + 0x100) =
                                             (uint)bVar66 * auVar73._0_4_ |
                                             (uint)!bVar66 * *(int *)(local_2d50.ray + 0x100);
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 4) =
                                             (uint)bVar9 * auVar73._4_4_ | (uint)!bVar9 * iVar52;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 8) =
                                             (uint)bVar10 * auVar73._8_4_ | (uint)!bVar10 * iVar35;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0xc) =
                                             (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * iVar36;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x10) =
                                             (uint)bVar12 * auVar73._16_4_ | (uint)!bVar12 * iVar37;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x14) =
                                             (uint)bVar13 * auVar73._20_4_ | (uint)!bVar13 * iVar38;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x18) =
                                             (uint)bVar16 * auVar73._24_4_ | (uint)!bVar16 * iVar39;
                                        *(uint *)((RayK<8> *)(local_2d50.ray + 0x100) + 0x1c) =
                                             (uint)bVar19 * auVar73._28_4_ | (uint)!bVar19 * iVar40;
                                      }
                                      bVar66 = (bool)(SUB41(local_2d20,0) & 1);
                                      bVar9 = (bool)((byte)((uint)local_2d20 >> 1) & 1);
                                      bVar10 = (bool)((byte)((uint)local_2d20 >> 2) & 1);
                                      bVar11 = (bool)((byte)((uint)local_2d20 >> 3) & 1);
                                      bVar12 = (bool)((byte)((uint)local_2d20 >> 4) & 1);
                                      bVar13 = (bool)((byte)((uint)local_2d20 >> 5) & 1);
                                      bVar16 = (bool)((byte)((uint)local_2d20 >> 6) & 1);
                                      bVar19 = (bool)((byte)((uint)local_2d20 >> 7) & 1);
                                      *(uint *)local_2c88 =
                                           (uint)bVar66 * *(int *)local_2c88 |
                                           (uint)!bVar66 * local_2cc0._0_4_;
                                      *(uint *)(local_2c88 + 4) =
                                           (uint)bVar9 * *(int *)(local_2c88 + 4) |
                                           (uint)!bVar9 * local_2cc0._4_4_;
                                      *(uint *)(local_2c88 + 8) =
                                           (uint)bVar10 * *(int *)(local_2c88 + 8) |
                                           (uint)!bVar10 * (int)fStack_2cb8;
                                      *(uint *)(local_2c88 + 0xc) =
                                           (uint)bVar11 * *(int *)(local_2c88 + 0xc) |
                                           (uint)!bVar11 * (int)fStack_2cb4;
                                      *(uint *)(local_2c88 + 0x10) =
                                           (uint)bVar12 * *(int *)(local_2c88 + 0x10) |
                                           (uint)!bVar12 * (int)fStack_2cb0;
                                      *(uint *)(local_2c88 + 0x14) =
                                           (uint)bVar13 * *(int *)(local_2c88 + 0x14) |
                                           (uint)!bVar13 * (int)fStack_2cac;
                                      *(uint *)(local_2c88 + 0x18) =
                                           (uint)bVar16 * *(int *)(local_2c88 + 0x18) |
                                           (uint)!bVar16 * (int)fStack_2ca8;
                                      *(uint *)(local_2c88 + 0x1c) =
                                           (uint)bVar19 * *(int *)(local_2c88 + 0x1c) |
                                           (uint)!bVar19 * (int)fStack_2ca4;
                                    }
                                    bVar57 = bVar57 & ~SUB41(local_2d20,0);
                                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar75 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar68 = vxorps_avx512vl(auVar94,auVar94);
                                    auVar70 = vmovdqa64_avx512vl(local_2d60);
                                  }
                                  auVar132 = ZEXT1664(auVar70);
                                  auVar154 = ZEXT1664(auVar68);
                                  auVar153 = ZEXT3264(auVar74);
                                  auVar152 = ZEXT3264(auVar78);
                                  auVar151 = ZEXT3264(auVar75);
                                  auVar150 = ZEXT3264(auVar73);
                                  auVar68 = vmovdqa64_avx512vl(local_2d70);
                                  auVar155 = ZEXT1664(auVar68);
                                }
                              }
                            }
                            uVar67 = uVar67 + 1;
                            pfVar64 = pfVar64 + 0x10;
                          } while (bVar57 != 0);
                          bVar57 = 0;
LAB_01d196c6:
                          bVar60 = bVar60 & bVar57;
                          bVar66 = bVar60 == 0;
                          uVar56 = local_2c68;
                          uVar67 = local_2cf0;
                          lVar55 = local_2c70;
                        }
                      } while ((!bVar66) && (uVar56 = uVar56 - 1 & uVar56, uVar56 != 0));
                    }
                    lVar55 = local_2bc8 + 1;
                  }
                  bVar60 = (byte)local_2d94 | ~bVar60;
                  local_2d94 = (uint)bVar60;
                  if (bVar60 == 0xff) {
                    local_2d94._0_1_ = 0xff;
                    goto LAB_01d1984c;
                  }
                  auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar66 = (bool)(bVar60 >> 1 & 1);
                  bVar9 = (bool)(bVar60 >> 2 & 1);
                  bVar10 = (bool)(bVar60 >> 3 & 1);
                  bVar11 = (bool)(bVar60 >> 4 & 1);
                  bVar12 = (bool)(bVar60 >> 5 & 1);
                  bVar13 = (bool)(bVar60 >> 6 & 1);
                  local_2740 = (uint)(bVar60 & 1) * auVar73._0_4_ | !(bool)(bVar60 & 1) * local_2740
                  ;
                  uStack_273c = (uint)bVar66 * auVar73._4_4_ | !bVar66 * uStack_273c;
                  uStack_2738 = (uint)bVar9 * auVar73._8_4_ | !bVar9 * uStack_2738;
                  uStack_2734 = (uint)bVar10 * auVar73._12_4_ | !bVar10 * uStack_2734;
                  uStack_2730 = (uint)bVar11 * auVar73._16_4_ | !bVar11 * uStack_2730;
                  uStack_272c = (uint)bVar12 * auVar73._20_4_ | !bVar12 * uStack_272c;
                  uStack_2728 = (uint)bVar13 * auVar73._24_4_ | !bVar13 * uStack_2728;
                  uStack_2724 = (uint)(bVar60 >> 7) * auVar73._28_4_ |
                                !(bool)(bVar60 >> 7) * uStack_2724;
                }
                goto LAB_01d1839b;
              }
              auVar73 = auVar152._0_32_;
              for (lVar55 = 0;
                  (auVar132 = ZEXT3264(auVar73), lVar55 != 4 &&
                  (uVar56 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar55 * 8), uVar56 != 8));
                  lVar55 = lVar55 + 1) {
                auVar81._4_4_ = fStack_281c;
                auVar81._0_4_ = local_2820;
                auVar81._8_4_ = fStack_2818;
                auVar81._12_4_ = fStack_2814;
                auVar81._16_4_ = fStack_2810;
                auVar81._20_4_ = fStack_280c;
                auVar81._24_4_ = fStack_2808;
                auVar81._28_4_ = uStack_2804;
                uVar65 = *(undefined4 *)(root.ptr + 0x20 + lVar55 * 4);
                auVar86._4_4_ = uVar65;
                auVar86._0_4_ = uVar65;
                auVar86._8_4_ = uVar65;
                auVar86._12_4_ = uVar65;
                auVar86._16_4_ = uVar65;
                auVar86._20_4_ = uVar65;
                auVar86._24_4_ = uVar65;
                auVar86._28_4_ = uVar65;
                auVar68 = vfmsub132ps_fma(auVar86,auVar81,local_2880);
                auVar82._4_4_ = fStack_27fc;
                auVar82._0_4_ = local_2800;
                auVar82._8_4_ = fStack_27f8;
                auVar82._12_4_ = fStack_27f4;
                auVar82._16_4_ = fStack_27f0;
                auVar82._20_4_ = fStack_27ec;
                auVar82._24_4_ = fStack_27e8;
                auVar82._28_4_ = uStack_27e4;
                uVar65 = *(undefined4 *)(root.ptr + 0x40 + lVar55 * 4);
                auVar87._4_4_ = uVar65;
                auVar87._0_4_ = uVar65;
                auVar87._8_4_ = uVar65;
                auVar87._12_4_ = uVar65;
                auVar87._16_4_ = uVar65;
                auVar87._20_4_ = uVar65;
                auVar87._24_4_ = uVar65;
                auVar87._28_4_ = uVar65;
                uVar65 = *(undefined4 *)(root.ptr + 0x60 + lVar55 * 4);
                auVar88._4_4_ = uVar65;
                auVar88._0_4_ = uVar65;
                auVar88._8_4_ = uVar65;
                auVar88._12_4_ = uVar65;
                auVar88._16_4_ = uVar65;
                auVar88._20_4_ = uVar65;
                auVar88._24_4_ = uVar65;
                auVar88._28_4_ = uVar65;
                auVar70 = vfmsub132ps_fma(auVar87,auVar82,local_2860);
                auVar92 = vfmsub132ps_fma(auVar88,local_27e0,local_2840);
                uVar65 = *(undefined4 *)(root.ptr + 0x30 + lVar55 * 4);
                auVar89._4_4_ = uVar65;
                auVar89._0_4_ = uVar65;
                auVar89._8_4_ = uVar65;
                auVar89._12_4_ = uVar65;
                auVar89._16_4_ = uVar65;
                auVar89._20_4_ = uVar65;
                auVar89._24_4_ = uVar65;
                auVar89._28_4_ = uVar65;
                auVar74 = vfmsub132ps_avx512vl(local_2880,auVar81,auVar89);
                uVar65 = *(undefined4 *)(root.ptr + 0x50 + lVar55 * 4);
                auVar79._4_4_ = uVar65;
                auVar79._0_4_ = uVar65;
                auVar79._8_4_ = uVar65;
                auVar79._12_4_ = uVar65;
                auVar79._16_4_ = uVar65;
                auVar79._20_4_ = uVar65;
                auVar79._24_4_ = uVar65;
                auVar79._28_4_ = uVar65;
                auVar76 = vfmsub132ps_avx512vl(local_2860,auVar82,auVar79);
                uVar65 = *(undefined4 *)(root.ptr + 0x70 + lVar55 * 4);
                auVar80._4_4_ = uVar65;
                auVar80._0_4_ = uVar65;
                auVar80._8_4_ = uVar65;
                auVar80._12_4_ = uVar65;
                auVar80._16_4_ = uVar65;
                auVar80._20_4_ = uVar65;
                auVar80._24_4_ = uVar65;
                auVar80._28_4_ = uVar65;
                auVar77 = vfmsub132ps_avx512vl(local_2840,local_27e0,auVar80);
                auVar75 = vpminsd_avx2(ZEXT1632(auVar68),auVar74);
                auVar78 = vpminsd_avx2(ZEXT1632(auVar70),auVar76);
                auVar75 = vpmaxsd_avx2(auVar75,auVar78);
                auVar78 = vpminsd_avx2(ZEXT1632(auVar92),auVar77);
                auVar75 = vpmaxsd_avx2(auVar75,auVar78);
                auVar78 = vpmaxsd_avx2(ZEXT1632(auVar68),auVar74);
                auVar74 = vpmaxsd_avx2(ZEXT1632(auVar70),auVar76);
                auVar74 = vpminsd_avx2(auVar78,auVar74);
                auVar78 = vpmaxsd_avx2(ZEXT1632(auVar92),auVar77);
                auVar74 = vpminsd_avx2(auVar74,auVar78);
                auVar78 = vpmaxsd_avx2(auVar75,local_2760);
                auVar83._4_4_ = uStack_273c;
                auVar83._0_4_ = local_2740;
                auVar83._8_4_ = uStack_2738;
                auVar83._12_4_ = uStack_2734;
                auVar83._16_4_ = uStack_2730;
                auVar83._20_4_ = uStack_272c;
                auVar83._24_4_ = uStack_2728;
                auVar83._28_4_ = uStack_2724;
                auVar74 = vpminsd_avx2(auVar74,auVar83);
                uVar53 = vpcmpd_avx512vl(auVar78,auVar74,2);
                uVar50 = uVar62;
                auVar84 = auVar73;
                if ((byte)uVar53 != 0) {
                  auVar78 = vblendmps_avx512vl(auVar152._0_32_,auVar75);
                  bVar66 = (bool)((byte)uVar53 & 1);
                  auVar84._0_4_ = (uint)bVar66 * auVar78._0_4_ | (uint)!bVar66 * auVar75._0_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 1) & 1);
                  auVar84._4_4_ = (uint)bVar66 * auVar78._4_4_ | (uint)!bVar66 * auVar75._4_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 2) & 1);
                  auVar84._8_4_ = (uint)bVar66 * auVar78._8_4_ | (uint)!bVar66 * auVar75._8_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 3) & 1);
                  auVar84._12_4_ = (uint)bVar66 * auVar78._12_4_ | (uint)!bVar66 * auVar75._12_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 4) & 1);
                  auVar84._16_4_ = (uint)bVar66 * auVar78._16_4_ | (uint)!bVar66 * auVar75._16_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 5) & 1);
                  auVar84._20_4_ = (uint)bVar66 * auVar78._20_4_ | (uint)!bVar66 * auVar75._20_4_;
                  bVar66 = (bool)((byte)(uVar53 >> 6) & 1);
                  auVar84._24_4_ = (uint)bVar66 * auVar78._24_4_ | (uint)!bVar66 * auVar75._24_4_;
                  bVar66 = SUB81(uVar53 >> 7,0);
                  auVar84._28_4_ = (uint)bVar66 * auVar78._28_4_ | (uint)!bVar66 * auVar75._28_4_;
                  uVar50 = uVar56;
                  if (uVar62 != 8) {
                    *puVar61 = uVar62;
                    puVar61 = puVar61 + 1;
                    *pauVar58 = auVar73;
                    pauVar58 = pauVar58 + 1;
                  }
                }
                auVar73 = auVar84;
                uVar62 = uVar50;
              }
              if (uVar62 == 8) goto LAB_01d18543;
              auVar47._4_4_ = uStack_273c;
              auVar47._0_4_ = local_2740;
              auVar47._8_4_ = uStack_2738;
              auVar47._12_4_ = uStack_2734;
              auVar47._16_4_ = uStack_2730;
              auVar47._20_4_ = uStack_272c;
              auVar47._24_4_ = uStack_2728;
              auVar47._28_4_ = uStack_2724;
              uVar20 = vcmpps_avx512vl(auVar73,auVar47,9);
              root.ptr = uVar62;
            } while ((byte)uVar67 < (byte)POPCOUNT((int)uVar20));
            *puVar61 = uVar62;
            puVar61 = puVar61 + 1;
            *pauVar58 = auVar73;
            pauVar58 = pauVar58 + 1;
LAB_01d18543:
            iVar52 = 4;
          }
          else {
            while (bVar60 = (byte)local_2d94, uVar62 != 0) {
              k = 0;
              for (uVar67 = uVar62; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              local_2d20 = (float)k;
              fStack_2d1c = (float)(k >> 0x20);
              uVar62 = uVar62 - 1 & uVar62;
              bVar66 = occluded1(local_2bd8,local_2be0,root,k,&local_2d79,ray,
                                 (TravRayK<8,_false> *)&local_2940.field_0,context);
              bVar57 = (byte)(1 << ((uint)local_2d20 & 0x1f));
              if (!bVar66) {
                bVar57 = 0;
              }
              local_2d94 = (uint)(bVar60 | bVar57);
              uVar67 = local_2cf0;
            }
            iVar52 = 3;
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar150 = ZEXT3264(auVar73);
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar151 = ZEXT3264(auVar73);
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar152 = ZEXT3264(auVar73);
            auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar153 = ZEXT3264(auVar73);
            auVar68 = vxorps_avx512vl(auVar154._0_16_,auVar154._0_16_);
            auVar154 = ZEXT1664(auVar68);
            auVar132 = ZEXT3264(_local_2ce0);
            if (bVar60 != 0xff) {
              auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              bVar66 = (bool)((byte)(local_2d94 >> 1) & 1);
              bVar9 = (bool)((byte)(local_2d94 >> 2) & 1);
              bVar10 = (bool)((byte)(local_2d94 >> 3) & 1);
              bVar11 = (bool)((byte)(local_2d94 >> 4) & 1);
              bVar12 = (bool)((byte)(local_2d94 >> 5) & 1);
              bVar13 = (bool)((byte)(local_2d94 >> 6) & 1);
              local_2740 = (uint)(bVar60 & 1) * auVar73._0_4_ | !(bool)(bVar60 & 1) * local_2740;
              uStack_273c = (uint)bVar66 * auVar73._4_4_ | !bVar66 * uStack_273c;
              uStack_2738 = (uint)bVar9 * auVar73._8_4_ | !bVar9 * uStack_2738;
              uStack_2734 = (uint)bVar10 * auVar73._12_4_ | !bVar10 * uStack_2734;
              uStack_2730 = (uint)bVar11 * auVar73._16_4_ | !bVar11 * uStack_2730;
              uStack_272c = (uint)bVar12 * auVar73._20_4_ | !bVar12 * uStack_272c;
              uStack_2728 = (uint)bVar13 * auVar73._24_4_ | !bVar13 * uStack_2728;
              uStack_2724 = (local_2d94 >> 7) * auVar73._28_4_ |
                            !SUB41(local_2d94 >> 7,0) * uStack_2724;
              iVar52 = 2;
            }
            if ((uint)uVar67 < (uint)POPCOUNT(uVar65)) goto LAB_01d183e3;
          }
          auVar73 = auVar151._0_32_;
          if (iVar52 == 3) {
LAB_01d1984c:
            local_2d94._0_1_ = (byte)local_2d94 & (byte)local_2ce4;
            bVar66 = (bool)((byte)local_2d94 >> 1 & 1);
            bVar9 = (bool)((byte)local_2d94 >> 2 & 1);
            bVar10 = (bool)((byte)local_2d94 >> 3 & 1);
            bVar11 = (bool)((byte)local_2d94 >> 4 & 1);
            bVar12 = (bool)((byte)local_2d94 >> 5 & 1);
            bVar13 = (bool)((byte)local_2d94 >> 6 & 1);
            *(uint *)local_2c88 =
                 (uint)((byte)local_2d94 & 1) * auVar73._0_4_ |
                 (uint)!(bool)((byte)local_2d94 & 1) * *(int *)local_2c88;
            *(uint *)(local_2c88 + 4) =
                 (uint)bVar66 * auVar73._4_4_ | (uint)!bVar66 * *(int *)(local_2c88 + 4);
            *(uint *)(local_2c88 + 8) =
                 (uint)bVar9 * auVar73._8_4_ | (uint)!bVar9 * *(int *)(local_2c88 + 8);
            *(uint *)(local_2c88 + 0xc) =
                 (uint)bVar10 * auVar73._12_4_ | (uint)!bVar10 * *(int *)(local_2c88 + 0xc);
            *(uint *)(local_2c88 + 0x10) =
                 (uint)bVar11 * auVar73._16_4_ | (uint)!bVar11 * *(int *)(local_2c88 + 0x10);
            *(uint *)(local_2c88 + 0x14) =
                 (uint)bVar12 * auVar73._20_4_ | (uint)!bVar12 * *(int *)(local_2c88 + 0x14);
            *(uint *)(local_2c88 + 0x18) =
                 (uint)bVar13 * auVar73._24_4_ | (uint)!bVar13 * *(int *)(local_2c88 + 0x18);
            *(uint *)(local_2c88 + 0x1c) =
                 (uint)((byte)local_2d94 >> 7) * auVar73._28_4_ |
                 (uint)!(bool)((byte)local_2d94 >> 7) * *(int *)(local_2c88 + 0x1c);
            return;
          }
        } while( true );
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }